

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O1

void __thiscall
chrono::fea::ShellANCF_Jacobian::Evaluate
          (ShellANCF_Jacobian *this,ChVectorN<double,_696> *result,double x,double y,double z)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ChElementShellANCF_3423 *pCVar28;
  size_t sVar29;
  pointer pMVar30;
  pointer pLVar31;
  element_type *peVar32;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  ChVectorN<double,_696> *pCVar37;
  Matrix<double,_9,_24,_1,_9,_24> *a_rhs;
  int ii;
  undefined1 *puVar38;
  double *pdVar39;
  Index row_1;
  mul_assign_op<double,_double> *pmVar40;
  Index col;
  long lVar41;
  ActualDstType actualDst;
  double *pdVar42;
  long lVar43;
  LhsNested actual_lhs;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar59 [32];
  undefined1 auVar66 [64];
  undefined1 auVar60 [32];
  undefined1 auVar67 [64];
  double dVar68;
  double dVar69;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  double dVar79;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  double dVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  double dVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  double dVar106;
  double dVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  double dVar120;
  undefined1 auVar119 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  double dVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  double dVar148;
  double dVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  double dVar158;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  ChMatrixNM<double,_1,_3> tempB3;
  ChMatrixNM<double,_1,_4> S_ANS;
  DstEvaluatorType dstEvaluator_1;
  ShapeVector Ny;
  ShapeVector Nx;
  ShapeVector N;
  ChMatrixNM<double,_1,_3> Nz_d0;
  ChVectorN<double,_6> stress;
  ChMatrixNM<double,_1,_3> tempB31;
  ChVectorN<double,_6> strain_EAS;
  ChMatrixNM<double,_6,_5> M;
  ChMatrixNM<double,_1,_3> Ny_d0;
  ChMatrixNM<double,_1,_3> Nx_d0;
  SrcEvaluatorType srcEvaluator_1;
  ChVectorN<double,_8> d0d0Nx;
  ChVectorN<double,_8> ddNy;
  ChVectorN<double,_8> ddNx;
  ShapeVector Nz;
  ChMatrixNM<double,_6,_24> strainD_til;
  ChVectorN<double,_8> d0d0Ny;
  ChMatrixNM<double,_6,_5> G;
  ChMatrixNM<double,_6,_24> strainD;
  ChMatrixNM<double,_24,_24> KTE;
  ChMatrixNM<double,_9,_9> Sigm;
  ChMatrixNM<double,_9,_24> Gd;
  ChMatrixNM<double,_5,_24> GDEPSP;
  mul_assign_op<double,_double> local_53a1;
  undefined1 local_53a0 [16];
  double local_5390;
  double dStack_5388;
  undefined1 local_5380 [16];
  double local_5370;
  double local_5368;
  double local_5360;
  double local_5358;
  double local_5350;
  double dStack_5348;
  double local_5340;
  double dStack_5338;
  undefined1 local_5330 [16];
  double local_5320;
  double local_5318;
  double local_5310;
  ulong local_5308;
  undefined1 local_5300 [16];
  double local_52f0;
  undefined8 uStack_52e8;
  undefined1 local_52e0 [16];
  double local_52d0;
  undefined8 uStack_52c8;
  undefined1 local_52c0 [16];
  undefined1 local_52b0 [16];
  undefined1 local_52a0 [16];
  double local_5290;
  undefined8 uStack_5288;
  undefined1 local_5280 [16];
  double local_5270;
  ulong local_5260;
  double local_5258;
  ulong local_5250;
  double local_5248;
  undefined1 local_5230 [16];
  undefined1 local_5220 [16];
  undefined1 local_5210 [16];
  undefined1 local_5200 [16];
  undefined1 local_51f0 [16];
  undefined1 local_51e0 [16];
  ChVectorN<double,_696> *local_51d0;
  undefined1 local_51c8 [16];
  double dStack_51b8;
  double dStack_51b0;
  double dStack_51a8;
  double dStack_51a0;
  double dStack_5198;
  double dStack_5190;
  undefined8 uStack_5188;
  ShapeVector local_5180;
  double local_5140 [15];
  ChMatrixNM<double,_1,_3> local_50c8;
  double local_50b0 [6];
  undefined1 local_5080 [64];
  undefined1 local_5040 [64];
  undefined1 local_5000 [64];
  undefined1 local_4fc0 [16];
  undefined1 local_4fb0 [16];
  undefined1 local_4fa0 [16];
  undefined1 local_4f90 [16];
  double local_4f80;
  double local_4f70 [6];
  double local_4f40 [6];
  ulong uStack_4f10;
  undefined8 uStack_4f08;
  undefined8 local_4f00;
  undefined8 uStack_4ef8;
  double adStack_4ef0 [3];
  ulong uStack_4ed8;
  undefined8 uStack_4ed0;
  double adStack_4ec8 [5];
  double adStack_4ea0 [16];
  ChMatrixNM<double,_1,_3> local_4e20;
  ChMatrixNM<double,_1,_3> local_4e08;
  undefined1 local_4df0 [32];
  scalar_constant_op<double> local_4dd0;
  ulong local_4dc8;
  Product<Eigen::Transpose<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>,_Eigen::Matrix<double,_9,_9,_1,_9,_9>,_0>
  local_4db8;
  Matrix<double,_9,_24,_1,_9,_24> *local_4da8;
  double local_4d98;
  Matrix<double,_8,_1,_0,_8,_1> local_4d80;
  Matrix<double,_8,_1,_0,_8,_1> local_4d40;
  Matrix<double,_8,_1,_0,_8,_1> local_4d00;
  ShapeVector local_4cc0;
  double local_4c80 [5];
  ulong uStack_4c58;
  undefined8 uStack_4c50;
  undefined8 uStack_4c48;
  undefined8 local_4c40;
  undefined8 uStack_4c38;
  undefined8 uStack_4c30;
  undefined8 uStack_4c28;
  undefined8 uStack_4c20;
  undefined8 uStack_4c18;
  undefined8 uStack_4c10;
  undefined8 uStack_4c08;
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined8 uStack_4bf0;
  undefined8 uStack_4be8;
  undefined8 uStack_4be0;
  undefined8 uStack_4bd8;
  undefined8 uStack_4bd0;
  undefined8 uStack_4bc8;
  double local_4bc0 [24];
  double local_4b00 [24];
  undefined1 local_4a40 [64];
  undefined1 local_4a00 [64];
  undefined1 local_49c0 [64];
  undefined1 local_4980 [64];
  undefined1 local_4940 [64];
  undefined1 local_4900 [64];
  undefined1 local_48c0 [64];
  undefined1 local_4880 [64];
  undefined1 local_4840 [64];
  Matrix<double,_8,_1,_0,_8,_1> local_4800;
  DstXprType local_47b0;
  Matrix<double,_6,_24,_1,_6,_24> local_46c0;
  undefined1 local_4240 [128];
  undefined1 local_41c0 [64];
  undefined1 local_4180 [64];
  undefined1 local_4140 [64];
  undefined1 local_4100 [64];
  undefined1 local_40c0 [64];
  undefined1 local_4080 [64];
  undefined1 local_4040 [64];
  undefined1 local_4000 [64];
  undefined1 local_3fc0 [64];
  undefined1 local_3f80 [64];
  undefined1 local_3f40 [64];
  undefined1 local_3f00 [64];
  Matrix<double,_9,_9,_1,_9,_9> local_3008;
  Matrix<double,_9,_24,_1,_9,_24> local_2d80;
  undefined1 local_26c0 [32];
  double local_26a0;
  double local_2670;
  Matrix<double,_24,_24,_1,_24,_24> *local_2640;
  double local_2610;
  Matrix<double,_24,_24,_1,_24,_24> local_2600;
  ulong local_1400;
  Matrix<double,_24,_24,_1,_24,_24> *local_1380;
  Matrix<double,_24,_24,_1,_24,_24> local_1340;
  undefined8 local_140;
  
  local_5230._8_8_ = local_5230._0_8_;
  local_5220._8_8_ = local_5220._0_8_;
  local_5300._8_8_ = local_5300._0_8_;
  local_52e0._8_8_ = local_52e0._0_8_;
  local_5140[6] = (1.0 - x) * 0.25;
  local_5140[3] = 1.0 - y;
  local_5140[0] = local_5140[6] * local_5140[3];
  local_5140[5] = z * this->m_element->m_thickness * 0.5 * 0.25;
  dVar106 = (1.0 - x) * local_5140[5];
  local_5140[1] = local_5140[3] * dVar106;
  local_5380._8_8_ = local_5380._0_8_;
  local_5380._0_8_ = x;
  local_5140[4] = (x + 1.0) * 0.25;
  local_5140[2] = local_5140[4] * local_5140[3];
  local_5140[5] = (x + 1.0) * local_5140[5];
  local_5140[3] = local_5140[3] * local_5140[5];
  local_53a0._8_8_ = local_53a0._0_8_;
  local_53a0._0_8_ = y;
  local_5140[7] = y + 1.0;
  local_5140[4] = local_5140[4] * local_5140[7];
  local_5140[5] = local_5140[7] * local_5140[5];
  local_5140[6] = local_5140[6] * local_5140[7];
  local_5140[7] = local_5140[7] * dVar106;
  local_51d0 = result;
  local_5290 = ChElementShellANCF_3423::Calc_detJ0
                         (this->m_element,x,y,z,&local_5180,(ShapeVector *)(local_51c8 + 8),
                          &local_4cc0,&local_4e08,&local_4e20,&local_50c8);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_5380._0_8_;
  auVar44 = ZEXT816(0x3fe0000000000000);
  auVar54 = vfmadd213sd_fma(ZEXT816(0xbfe0000000000000),auVar45,auVar44);
  local_5260 = auVar54._0_8_;
  auVar54 = vfmadd213sd_fma(auVar44,auVar45,auVar44);
  local_5258 = auVar54._0_8_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_53a0._0_8_;
  auVar54 = vfmadd213sd_fma(ZEXT816(0xbfe0000000000000),auVar47,auVar44);
  local_5308 = auVar54._0_8_;
  auVar54 = vfmadd213sd_fma(auVar44,auVar47,auVar44);
  local_5310 = auVar54._0_8_;
  local_4f40[1] = 0.0;
  local_4f40[2] = 0.0;
  local_4f40[3] = 0.0;
  local_4f40[4] = 0.0;
  local_4f40[5] = 0.0;
  uStack_4f08 = 0;
  local_4f00 = 0;
  uStack_4ef8 = 0;
  adStack_4ef0[0] = 0.0;
  adStack_4ef0[1] = 0.0;
  uStack_4ed0 = 0;
  adStack_4ec8[0] = 0.0;
  adStack_4ec8[1] = 0.0;
  adStack_4ec8[2] = 0.0;
  adStack_4ec8[3] = 0.0;
  adStack_4ea0[0] = 0.0;
  adStack_4ea0[1] = 0.0;
  adStack_4ea0[2] = 0.0;
  adStack_4ea0[3] = 0.0;
  adStack_4ea0[4] = 0.0;
  adStack_4ea0[5] = 0.0;
  adStack_4ea0[6] = 0.0;
  adStack_4ea0[7] = 0.0;
  adStack_4ea0[8] = 0.0;
  adStack_4ea0[9] = 0.0;
  local_4f40[0] = (double)local_5380._0_8_;
  uStack_4f10 = local_53a0._0_8_;
  adStack_4ef0[2] = (double)local_5380._0_8_;
  uStack_4ed8 = local_53a0._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       local_4e08.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  local_5330._8_8_ = 0;
  local_5330._0_8_ =
       local_4e08.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       local_4e20.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  local_52c0._8_8_ = 0;
  local_52c0._0_8_ =
       local_4e08.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  local_51e0._8_8_ = 0;
  local_51e0._0_8_ =
       local_4e20.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       local_4e20.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  local_52f0 = -local_4e08.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                m_data.array[2];
  uStack_52e8 = 0x8000000000000000;
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       local_4e20.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1] *
       local_4e08.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  local_53a0 = vfmsub231sd_fma(auVar48,local_5330,auVar52);
  local_5320 = local_4e20.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
               m_data.array[2];
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       local_4e20.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2] *
       local_4e08.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  local_5380 = vfmsub231sd_fma(auVar50,local_52c0,local_51e0);
  local_52d0 = -0.0;
  uStack_52c8 = 0x8000000000000000;
  local_51f0._8_8_ = 0x8000000000000000;
  local_51f0._0_8_ =
       -local_4e08.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
        array[1];
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       local_4e20.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0] *
       local_4e08.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar44 = vfmsub231sd_fma(auVar51,auVar49,auVar46);
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       local_4e08.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1] *
       local_4e08.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar54 = vfmadd231sd_fma(auVar54,auVar49,auVar49);
  auVar54 = vfmadd231sd_fma(auVar54,local_52c0,local_52c0);
  local_5360 = local_4e08.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
               m_data.array[0];
  local_52b0._0_8_ =
       local_4e20.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  local_52b0._0_8_ =
       local_4e20.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  local_5390 = auVar44._0_8_;
  uStack_5288 = extraout_XMM0_Qb;
  local_5250 = local_5308;
  local_5248 = local_5310;
  adStack_4ec8[4] = z;
  if (auVar54._0_8_ < 0.0) {
    local_5350 = sqrt(auVar54._0_8_);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_5390;
  }
  else {
    auVar54 = vsqrtsd_avx(auVar54,auVar54);
    local_5350 = auVar54._0_8_;
  }
  local_5350 = 1.0 / local_5350;
  local_5340 = local_5360 * local_5350;
  dVar106 = local_5350 * (double)local_5330._0_8_;
  local_5350 = local_5350 * (double)local_52c0._0_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = (double)local_5380._0_8_ * (double)local_5380._0_8_;
  auVar54 = vfmadd231sd_fma(auVar53,local_53a0,local_53a0);
  auVar54 = vfmadd231sd_fma(auVar54,auVar44,auVar44);
  if (auVar54._0_8_ < 0.0) {
    dVar68 = sqrt(auVar54._0_8_);
  }
  else {
    auVar54 = vsqrtsd_avx(auVar54,auVar54);
    dVar68 = auVar54._0_8_;
    local_5390 = auVar44._0_8_;
  }
  bVar34 = 2.2250738585072014e-308 <= dVar68;
  dVar68 = 1.0 / dVar68;
  local_5200._0_8_ =
       (ulong)bVar34 * (long)(dVar68 * (double)local_53a0._0_8_) +
       (ulong)!bVar34 * 0x3ff0000000000000;
  local_5200._8_8_ = 0;
  uVar33 = (ulong)bVar34 * (long)(dVar68 * (double)local_5380._0_8_);
  local_5210._8_8_ = 0;
  local_5210._0_8_ = uVar33;
  dVar68 = (double)((ulong)bVar34 * (long)(local_5390 * dVar68));
  local_52a0._8_8_ = 0;
  local_52a0._0_8_ = dVar68;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_5350;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = dVar68 * dVar106;
  auVar54 = vfmsub231sd_fma(auVar121,local_5210,auVar55);
  local_5358 = auVar54._0_8_;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = local_5340;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = local_5350 * (double)local_5200._0_8_;
  auVar54 = vfmsub231sd_fma(auVar91,auVar108,local_52a0);
  local_52e0._0_8_ = auVar54._0_8_;
  local_5368 = local_5340 * (double)(uVar33 ^ (ulong)local_52d0);
  local_5390 = (this->m_element->m_layers).
               super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
               ._M_impl.super__Vector_impl_data._M_start[this->m_kl].m_theta;
  local_5318 = cos(local_5390);
  local_5370 = local_5318 * local_5340;
  local_5300._0_8_ = local_5318 * dVar106;
  dVar68 = sin(local_5390);
  local_5220._0_8_ = dVar68 * local_5358 + local_5370;
  local_5300._0_8_ = dVar68 * (double)local_52e0._0_8_ + (double)local_5300._0_8_;
  local_5370 = dVar68;
  local_5230._0_8_ = sin(local_5390);
  dVar69 = cos(local_5390);
  dVar79 = dVar69 * local_5358 - (double)local_5230._0_8_ * local_5340;
  dVar80 = dVar69 * (double)local_52e0._0_8_ - (double)local_5230._0_8_ * dVar106;
  dVar68 = (double)local_5230._0_8_ * local_5350;
  auVar92._8_8_ = 0;
  auVar92._0_8_ =
       local_50c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar132._8_8_ = 0;
  auVar132._0_8_ =
       local_50c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar139._8_8_ = 0;
  auVar139._0_8_ =
       local_50c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar174._8_8_ = 0;
  auVar174._0_8_ = local_5320;
  auVar150._8_8_ = 0;
  auVar150._0_8_ =
       local_5320 *
       local_50c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar231._8_8_ = 0;
  auVar231._0_8_ = local_52b0._0_8_;
  auVar44 = vfmsub231sd_avx512f(auVar150,auVar231,auVar92);
  auVar166._8_8_ = 0;
  auVar166._0_8_ =
       local_51e0._0_8_ *
       local_50c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar54 = vfmsub231sd_fma(auVar166,auVar132,auVar174);
  auVar54 = vunpcklpd_avx(auVar44,auVar54);
  auVar44 = vmulsd_avx512f(auVar231,auVar132);
  auVar46 = vfmsub231sd_fma(auVar44,auVar139,local_51e0);
  auVar170._8_8_ = 0;
  auVar170._0_8_ =
       local_50c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2] * (double)local_51f0._0_8_;
  auVar44 = vfmadd213sd_fma(local_52c0,auVar139,auVar170);
  auVar44 = vunpcklpd_avx(auVar46,auVar44);
  auVar171._8_8_ = 0;
  auVar171._0_8_ =
       local_50c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0] * local_52f0;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = local_5360;
  auVar45 = vfmadd231sd_avx512f(auVar171,auVar227,auVar92);
  auVar46 = vmulsd_avx512f(auVar227,auVar139);
  auVar46 = vfmsub231sd_fma(auVar46,local_5330,auVar132);
  auVar46 = vunpcklpd_avx(auVar45,auVar46);
  auVar45 = vunpcklpd_avx(local_53a0,local_5380);
  auVar159._8_8_ = local_5290;
  auVar159._0_8_ = local_5290;
  local_51f0 = vdivpd_avx(auVar54,auVar159);
  local_52e0 = vdivpd_avx(auVar44,auVar159);
  auVar54 = vdivpd_avx(auVar46,auVar159);
  auVar44 = vdivpd_avx(auVar45,auVar159);
  local_5230 = vshufpd_avx(local_52e0,local_52e0,1);
  local_4fa0 = vshufpd_avx(local_51f0,local_51f0,1);
  auVar46 = vshufpd_avx(auVar44,auVar44,1);
  auVar180._8_8_ = 0;
  auVar180._0_8_ = local_5300._0_8_;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = local_5220._0_8_;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = (double)local_5300._0_8_ * local_4fa0._0_8_;
  auVar45 = vfmadd231sd_fma(auVar172,auVar177,local_51f0);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = dVar80;
  auVar47 = vmulsd_avx512f(auVar122,local_4fa0);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = dVar79;
  auVar48 = vfmadd231sd_avx512f(auVar47,auVar109,local_51f0);
  auVar160._8_8_ = 0;
  auVar160._0_8_ = local_5210._0_8_ * local_4fa0._0_8_;
  auVar47 = vfmadd231sd_fma(auVar160,local_5200,local_51f0);
  auVar49 = vmulsd_avx512f(auVar180,auVar54);
  auVar50 = vfmadd231sd_avx512f(auVar49,auVar177,local_5230);
  auVar151._8_8_ = 0;
  auVar151._0_8_ = auVar54._0_8_ * dVar80;
  auVar49 = vfmadd231sd_fma(auVar151,auVar109,local_5230);
  local_52f0 = auVar49._0_8_;
  auVar49 = vmulsd_avx512f(local_5210,auVar54);
  auVar49 = vfmadd231sd_avx512f(auVar49,local_5200,local_5230);
  auVar51 = vmulsd_avx512f(auVar46,auVar180);
  auVar51 = vfmadd231sd_avx512f(auVar51,auVar44,auVar177);
  auVar52 = vmulsd_avx512f(auVar46,auVar122);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = dVar79;
  auVar52 = vfmadd231sd_avx512f(auVar52,auVar44,auVar110);
  auVar53 = vmulsd_avx512f(local_5210,auVar46);
  auVar53 = vfmadd231sd_avx512f(auVar53,auVar44,local_5200);
  pdVar39 = (double *)
            ((long)&(this->m_element->m_layers).
                    super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->m_kl].m_T0.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage + 0x28);
  local_2600.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.array
  [10] = pdVar39[-8];
  local_26c0._16_8_ = &local_26a0;
  lVar41 = 0;
  pmVar40 = (mul_assign_op<double,_double> *)local_26c0._16_8_;
  do {
    dVar79 = local_4f40[lVar41];
    dVar80 = local_4f40[lVar41 + 5];
    dVar90 = adStack_4ef0[lVar41];
    dVar1 = adStack_4ec8[lVar41];
    dVar2 = adStack_4ea0[lVar41];
    dVar138 = adStack_4ea0[lVar41 + 5];
    lVar43 = 0;
    pdVar42 = pdVar39;
    do {
      *(double *)(pmVar40 + lVar43 * 8) =
           dVar79 * ((plain_array<double,_36,_1,_32> *)(pdVar42 + -5))->array[0] +
           dVar80 * pdVar42[-4] + dVar90 * pdVar42[-3] +
           dVar1 * pdVar42[-2] + dVar2 * pdVar42[-1] + dVar138 * *pdVar42;
      lVar43 = lVar43 + 1;
      pdVar42 = pdVar42 + 6;
    } while (lVar43 != 6);
    lVar41 = lVar41 + 1;
    pmVar40 = pmVar40 + 0x30;
  } while (lVar41 != 5);
  vmovsd_avx512f(auVar53);
  vmovsd_avx512f(auVar51);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = dVar106;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_5368;
  auVar51 = vfmadd213sd_avx512f(auVar140,local_5200,auVar3);
  local_5368 = local_5318 * local_5350 + auVar51._0_8_ * local_5370;
  local_5350 = auVar51._0_8_ * dVar69 - dVar68;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = (double)local_5330._0_8_ * (double)((ulong)local_51e0._0_8_ ^ (ulong)local_52d0);
  auVar228._8_8_ = 0;
  auVar228._0_8_ = local_5360;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = local_52b0._0_8_;
  auVar51 = vfmadd213sd_avx512f(auVar232,auVar228,auVar93);
  auVar35._8_8_ = uStack_5288;
  auVar35._0_8_ = local_5290;
  auVar51 = vdivsd_avx512f(auVar51,auVar35);
  local_52b0 = vshufpd_avx(auVar54,auVar54,1);
  auVar123._8_8_ = 0;
  auVar123._0_8_ = local_5350;
  auVar48 = vfmadd231sd_avx512f(auVar48,auVar123,local_52e0);
  vmovsd_avx512f(auVar48);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = local_5368;
  auVar48 = vfmadd231sd_avx512f(auVar50,auVar133,local_52b0);
  vmovsd_avx512f(auVar48);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_52a0._0_8_;
  auVar49 = vfmadd231sd_avx512f(auVar49,local_52b0,auVar4);
  vmovsd_avx512f(auVar49);
  local_5360 = auVar51._0_8_;
  auVar49 = vfmadd231sd_avx512f(auVar52,auVar123,auVar51);
  vmovsd_avx512f(auVar49);
  local_2600.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.array
  [10] = local_2600.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
         m_data.array[10] / local_5290;
  local_2d80.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array
  [0] = (double)&local_47b0;
  pdVar42 = (double *)&local_2d80;
  local_4240._8_8_ = local_26c0;
  local_4240._0_8_ = pdVar42;
  local_4240._16_8_ = local_4c80;
  local_4240._24_8_ =
       local_2d80.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
       array[0];
  local_47b0.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data.array[0]
       = local_2600.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
         m_data.array[10] * local_26a0;
  local_47b0.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data.array[1]
       = local_2600.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
         m_data.array[10] * local_2670;
  local_47b0.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data.array[2]
       = local_2600.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
         m_data.array[10] * (double)local_2640;
  local_47b0.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data.array[3]
       = local_2600.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
         m_data.array[10] * local_2610;
  local_5220 = auVar46;
  local_5210 = auVar44;
  local_5200 = auVar54;
  local_53a0._0_8_ = auVar45._0_8_;
  local_5380._0_8_ = auVar47._0_8_;
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_5,_1,_6,_5>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_5,_0,_6,_5>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_30>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_5,_1,_6,_5>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_5,_0,_6,_5>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_4240);
  pCVar28 = this->m_element;
  sVar29 = this->m_kl;
  pMVar30 = (pCVar28->m_alphaEAS).
            super__Vector_base<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_std::allocator<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  dVar68 = pMVar30[sVar29].super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
           m_data.array[0];
  dVar79 = *(double *)
            ((long)&pMVar30[sVar29].super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                    m_storage.m_data + 8);
  pdVar39 = (double *)
            ((long)&pMVar30[sVar29].super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                    m_storage.m_data + 0x10);
  dVar80 = *pdVar39;
  dVar69 = pdVar39[1];
  dVar106 = *(double *)
             ((long)&pMVar30[sVar29].super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                     m_storage.m_data + 0x20);
  pdVar39 = local_47b0.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data
            .array + 4;
  lVar41 = 0;
  do {
    local_4f70[lVar41] =
         dVar106 * *pdVar39 +
         dVar68 * ((plain_array<double,_30,_1,_16> *)(pdVar39 + -4))->array[0] +
         dVar80 * pdVar39[-2] + dVar79 * pdVar39[-3] + dVar69 * pdVar39[-1];
    lVar41 = lVar41 + 1;
    pdVar39 = pdVar39 + 5;
  } while (lVar41 != 6);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = local_53a0._0_8_;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = local_5368;
  auVar54 = vfmadd231sd_fma(auVar81,auVar111,local_52e0);
  local_53a0._0_8_ = auVar54._0_8_;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = local_5380._0_8_;
  auVar54 = vfmadd231sd_fma(auVar94,local_52a0,local_52e0);
  local_5380._0_8_ = auVar54._0_8_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = local_5350;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = local_52f0;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_52b0._0_8_;
  auVar54 = vfmadd132sd_fma(auVar70,auVar95,auVar5);
  local_5350 = auVar54._0_8_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = local_5360;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = local_5340;
  auVar54 = vfmadd231sd_fma(auVar96,auVar71,auVar111);
  local_5340 = auVar54._0_8_;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = local_5390;
  auVar54 = vfmadd231sd_fma(auVar97,local_52a0,auVar71);
  local_5390 = auVar54._0_8_;
  local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3]
       = 0.0;
  local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4]
       = 0.0;
  local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5]
       = 0.0;
  local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6]
       = 0.0;
  local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7]
       = 0.0;
  local_4240._0_8_ = (DstEvaluatorType *)0x3ff0000000000000;
  local_26c0._0_8_ = &local_5180;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&pCVar28->m_ddT,(Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)local_26c0,
             &local_4d00,(Scalar *)local_4240);
  local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3]
       = 0.0;
  local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4]
       = 0.0;
  local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5]
       = 0.0;
  local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6]
       = 0.0;
  local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7]
       = 0.0;
  local_4240._0_8_ = (DstEvaluatorType *)0x3ff0000000000000;
  local_26c0._0_8_ = local_51c8 + 8;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&this->m_element->m_ddT,(Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)local_26c0,
             &local_4d40,(Scalar *)local_4240);
  local_4d80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_4d80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_4d80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_4d80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3]
       = 0.0;
  local_4d80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4]
       = 0.0;
  local_4d80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5]
       = 0.0;
  local_4d80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6]
       = 0.0;
  local_4d80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7]
       = 0.0;
  local_4240._0_8_ = (DstEvaluatorType *)0x3ff0000000000000;
  local_26c0._0_8_ = &local_5180;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&this->m_element->m_d0d0T,
             (Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)local_26c0,&local_4d80,
             (Scalar *)local_4240);
  local_4800.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_4800.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_4800.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_4800.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3]
       = 0.0;
  local_4800.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4]
       = 0.0;
  local_4800.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5]
       = 0.0;
  local_4800.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6]
       = 0.0;
  local_4800.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7]
       = 0.0;
  local_4240._0_8_ = 0x3ff0000000000000;
  local_26c0._0_8_ = local_51c8 + 8;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&this->m_element->m_d0d0T,
             (Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)local_26c0,&local_4800,
             (Scalar *)local_4240);
  auVar67._8_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar67._0_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar67._16_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar67._24_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar67._32_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar67._40_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar67._48_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar67._56_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar62._8_8_ =
       local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[1];
  auVar62._0_8_ =
       local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[0];
  auVar62._16_8_ =
       local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[2];
  auVar62._24_8_ =
       local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[3];
  auVar62._32_8_ =
       local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[4];
  auVar62._40_8_ =
       local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[5];
  auVar62._48_8_ =
       local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[6];
  auVar62._56_8_ =
       local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[7];
  auVar62 = vmulpd_avx512f(auVar67,auVar62);
  auVar56 = vextractf64x4_avx512f(auVar62,1);
  auVar63._8_8_ =
       local_4d80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[1];
  auVar63._0_8_ =
       local_4d80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[0];
  auVar63._16_8_ =
       local_4d80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[2];
  auVar63._24_8_ =
       local_4d80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[3];
  auVar63._32_8_ =
       local_4d80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[4];
  auVar63._40_8_ =
       local_4d80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[5];
  auVar63._48_8_ =
       local_4d80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[6];
  auVar63._56_8_ =
       local_4d80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[7];
  auVar63 = vmulpd_avx512f(auVar67,auVar63);
  auVar57 = vextractf64x4_avx512f(auVar63,1);
  auVar65._8_8_ = dStack_51b8;
  auVar65._0_8_ = local_51c8._8_8_;
  auVar65._16_8_ = dStack_51b0;
  auVar65._24_8_ = dStack_51a8;
  auVar65._32_8_ = dStack_51a0;
  auVar65._40_8_ = dStack_5198;
  auVar65._48_8_ = dStack_5190;
  auVar65._56_8_ = uStack_5188;
  auVar66._8_8_ =
       local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[1];
  auVar66._0_8_ =
       local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[0];
  auVar66._16_8_ =
       local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[2];
  auVar66._24_8_ =
       local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[3];
  auVar66._32_8_ =
       local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[4];
  auVar66._40_8_ =
       local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[5];
  auVar66._48_8_ =
       local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[6];
  auVar66._56_8_ =
       local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[7];
  auVar64 = vmulpd_avx512f(auVar65,auVar66);
  auVar58 = vextractf64x4_avx512f(auVar64,1);
  auVar36._8_8_ =
       local_4800.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[1];
  auVar36._0_8_ =
       local_4800.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[0];
  auVar36._16_8_ =
       local_4800.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[2];
  auVar36._24_8_ =
       local_4800.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[3];
  auVar36._32_8_ =
       local_4800.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[4];
  auVar36._40_8_ =
       local_4800.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[5];
  auVar36._48_8_ =
       local_4800.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[6];
  auVar36._56_8_ =
       local_4800.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[7];
  auVar65 = vmulpd_avx512f(auVar65,auVar36);
  auVar59 = vextractf64x4_avx512f(auVar65,1);
  auVar66 = vmulpd_avx512f(auVar67,auVar66);
  auVar60 = vextractf64x4_avx512f(auVar66,1);
  auVar67 = vmulpd_avx512f(auVar67,auVar36);
  auVar61 = vextractf64x4_avx512f(auVar67,1);
  dVar106 = ((auVar62._0_8_ + auVar56._0_8_ + auVar62._8_8_ + auVar56._8_8_ +
             auVar62._16_8_ + auVar56._16_8_ + auVar62._24_8_ + auVar56._24_8_) -
            (auVar63._0_8_ + auVar57._0_8_ + auVar63._8_8_ + auVar57._8_8_ +
            auVar63._16_8_ + auVar57._16_8_ + auVar63._24_8_ + auVar57._24_8_)) * 0.5;
  dVar68 = ((auVar64._0_8_ + auVar58._0_8_ + auVar64._8_8_ + auVar58._8_8_ +
            auVar64._16_8_ + auVar58._16_8_ + auVar64._24_8_ + auVar58._24_8_) -
           (auVar65._0_8_ + auVar59._0_8_ + auVar65._8_8_ + auVar59._8_8_ +
           auVar65._16_8_ + auVar59._16_8_ + auVar65._24_8_ + auVar59._24_8_)) * 0.5;
  dVar80 = (auVar66._0_8_ + auVar60._0_8_ + auVar66._8_8_ + auVar60._8_8_ +
           auVar66._16_8_ + auVar60._16_8_ + auVar66._24_8_ + auVar60._24_8_) -
           (auVar67._0_8_ + auVar61._0_8_ + auVar67._8_8_ + auVar61._8_8_ +
           auVar67._16_8_ + auVar61._16_8_ + auVar67._24_8_ + auVar61._24_8_);
  pCVar28 = this->m_element;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = local_5140[0];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (pCVar28->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>
                 .m_storage.m_data.array[0];
  auVar98._8_8_ = 0;
  auVar98._0_8_ =
       local_5140[2] *
       (pCVar28->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[1];
  auVar54 = vfmadd231sd_fma(auVar98,auVar82,auVar6);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = local_5140[4];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (pCVar28->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>
                 .m_storage.m_data.array[2];
  auVar54 = vfmadd132sd_fma(auVar83,auVar54,auVar7);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = local_5140[6];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (pCVar28->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>
                 .m_storage.m_data.array[3];
  auVar54 = vfmadd132sd_fma(auVar134,auVar54,auVar8);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = local_5308;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (pCVar28->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>
                 .m_storage.m_data.array[6];
  auVar84._8_8_ = 0;
  auVar84._0_8_ =
       local_5310 *
       (pCVar28->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[7];
  auVar46 = vfmadd231sd_fma(auVar84,auVar99,auVar9);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = local_5260;
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (pCVar28->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[4];
  auVar100._8_8_ = 0;
  auVar100._0_8_ =
       local_5258 *
       (pCVar28->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[5];
  auVar45 = vfmadd231sd_fma(auVar100,auVar141,auVar10);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = dVar106;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = local_53a0._0_8_;
  auVar44 = vmulsd_avx512f(auVar218,auVar112);
  auVar183._8_8_ = 0;
  auVar183._0_8_ = local_52c0._0_8_;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = (double)local_52c0._0_8_ * (double)local_52c0._0_8_ * dVar68;
  auVar44 = vfmadd231sd_avx512f(auVar152,auVar218,auVar44);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar80;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = local_53a0._0_8_;
  auVar47 = vmulsd_avx512f(auVar219,auVar72);
  auVar44 = vfmadd213sd_fma(auVar47,auVar183,auVar44);
  auVar212._8_8_ = 0;
  auVar212._0_8_ = local_5340;
  auVar47 = vmulsd_avx512f(auVar212,auVar54);
  auVar44 = vfmadd213sd_avx512f(auVar47,auVar212,auVar44);
  auVar47 = vmulsd_avx512f(auVar219,auVar46);
  auVar213._8_8_ = 0;
  auVar213._0_8_ = local_5340;
  auVar44 = vfmadd213sd_avx512f(auVar47,auVar213,auVar44);
  auVar153._8_8_ = 0;
  auVar153._0_8_ = (double)local_52c0._0_8_ * auVar45._0_8_;
  auVar47 = vfmadd213sd_avx512f(auVar153,auVar213,auVar44);
  auVar181._8_8_ = 0;
  auVar181._0_8_ = local_5330._0_8_;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = dVar68;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = local_5350;
  auVar44 = vmulsd_avx512f(auVar194,auVar124);
  auVar44 = vmulsd_avx512f(auVar194,auVar44);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = (double)local_5330._0_8_ * dVar106;
  auVar44 = vfmadd231sd_fma(auVar44,auVar181,auVar142);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = (double)local_5330._0_8_ * dVar80;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = local_5350;
  auVar44 = vfmadd213sd_avx512f(auVar143,auVar195,auVar44);
  auVar188._8_8_ = 0;
  auVar188._0_8_ = local_5358;
  auVar49 = vmulsd_avx512f(auVar188,auVar54);
  auVar44 = vfmadd213sd_avx512f(auVar49,auVar188,auVar44);
  auVar144._8_8_ = 0;
  auVar144._0_8_ = (double)local_5330._0_8_ * auVar46._0_8_;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = local_5358;
  auVar44 = vfmadd213sd_avx512f(auVar144,auVar189,auVar44);
  auVar49 = vmulsd_avx512f(auVar195,auVar45);
  auVar44 = vfmadd213sd_avx512f(auVar49,auVar189,auVar44);
  local_5300 = vunpcklpd_avx(auVar47,auVar44);
  auVar145._8_8_ = 0;
  auVar145._0_8_ = dVar106 + dVar106;
  auVar49 = vmulsd_avx512f(auVar219,auVar145);
  dVar79 = (double)local_52c0._0_8_ * (dVar68 + dVar68);
  auVar167._8_8_ = 0;
  auVar167._0_8_ = dVar79;
  auVar44 = vmulsd_avx512f(auVar195,auVar167);
  auVar44 = vfmadd231sd_fma(auVar44,auVar49,auVar181);
  auVar47 = vmulsd_avx512f(auVar219,auVar195);
  auVar47 = vfmadd231sd_fma(auVar47,auVar181,auVar183);
  local_52a0._0_8_ = auVar47._0_8_;
  auVar44 = vfmadd231sd_fma(auVar44,auVar72,auVar47);
  auVar175._8_8_ = 0;
  auVar175._0_8_ = auVar54._0_8_ + auVar54._0_8_;
  auVar48 = vmulsd_avx512f(auVar213,auVar175);
  auVar44 = vfmadd231sd_avx512f(auVar44,auVar48,auVar189);
  auVar220._8_8_ = 0;
  auVar220._0_8_ = local_53a0._0_8_;
  auVar47 = vmulsd_avx512f(auVar189,auVar220);
  auVar47 = vfmadd231sd_avx512f(auVar47,auVar181,auVar213);
  local_5308 = auVar47._0_8_;
  auVar44 = vfmadd231sd_fma(auVar44,auVar46,auVar47);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = local_5358;
  auVar47 = vmulsd_avx512f(auVar190,auVar183);
  auVar196._8_8_ = 0;
  auVar196._0_8_ = local_5350;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = local_5340;
  auVar47 = vfmadd231sd_avx512f(auVar47,auVar196,auVar214);
  local_5310 = auVar47._0_8_;
  auVar47 = vfmadd231sd_fma(auVar44,auVar45,auVar47);
  auVar200._8_8_ = 0;
  auVar200._0_8_ = local_5380._0_8_;
  auVar44 = vmulsd_avx512f(auVar200,auVar112);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = local_52d0;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = local_52d0 * local_52d0 * dVar68;
  auVar44 = vfmadd231sd_avx512f(auVar125,auVar200,auVar44);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar80;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = local_5380._0_8_;
  auVar50 = vmulsd_avx512f(auVar201,auVar73);
  auVar44 = vfmadd213sd_fma(auVar50,auVar186,auVar44);
  auVar206._8_8_ = 0;
  auVar206._0_8_ = local_5390;
  auVar54 = vmulsd_avx512f(auVar206,auVar54);
  auVar54 = vfmadd213sd_avx512f(auVar54,auVar206,auVar44);
  auVar44 = vmulsd_avx512f(auVar201,auVar46);
  auVar207._8_8_ = 0;
  auVar207._0_8_ = local_5390;
  auVar54 = vfmadd213sd_avx512f(auVar44,auVar207,auVar54);
  auVar126._8_8_ = 0;
  auVar126._0_8_ = local_52d0 * auVar45._0_8_;
  auVar54 = vfmadd213sd_avx512f(auVar126,auVar207,auVar54);
  local_4fb0 = vunpcklpd_avx(auVar47,auVar54);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = local_52d0 * dVar79;
  auVar54 = vfmadd231sd_avx512f(auVar113,auVar201,auVar49);
  auVar44 = vmulsd_avx512f(auVar220,auVar186);
  auVar44 = vfmadd231sd_avx512f(auVar44,auVar201,auVar183);
  local_5368 = auVar44._0_8_;
  auVar54 = vfmadd231sd_fma(auVar54,auVar73,auVar44);
  auVar54 = vfmadd231sd_avx512f(auVar54,auVar207,auVar48);
  auVar44 = vmulsd_avx512f(auVar207,auVar220);
  auVar202._8_8_ = 0;
  auVar202._0_8_ = local_5380._0_8_;
  auVar44 = vfmadd231sd_avx512f(auVar44,auVar202,auVar214);
  local_5318 = auVar44._0_8_;
  auVar54 = vfmadd231sd_fma(auVar54,auVar46,auVar44);
  auVar208._8_8_ = 0;
  auVar208._0_8_ = local_5390;
  auVar44 = vmulsd_avx512f(auVar208,auVar183);
  auVar44 = vfmadd231sd_avx512f(auVar44,auVar186,auVar214);
  local_52f0 = auVar44._0_8_;
  auVar54 = vfmadd231sd_fma(auVar54,auVar45,auVar44);
  auVar161._8_8_ = 0;
  auVar161._0_8_ = dVar68 + dVar68;
  auVar44 = vmulsd_avx512f(auVar196,auVar161);
  auVar127._8_8_ = 0;
  auVar127._0_8_ = (double)local_5330._0_8_ * (dVar106 + dVar106);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = local_52d0 * auVar44._0_8_;
  auVar44 = vfmadd231sd_avx512f(auVar135,auVar202,auVar127);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = (double)local_5330._0_8_ * local_52d0;
  auVar47 = vfmadd231sd_avx512f(auVar128,auVar202,auVar196);
  local_5370 = auVar47._0_8_;
  auVar44 = vfmadd231sd_fma(auVar44,auVar47,auVar73);
  auVar47 = vmulsd_avx512f(auVar190,auVar175);
  auVar44 = vfmadd213sd_avx512f(auVar47,auVar208,auVar44);
  auVar47 = vmulsd_avx512f(auVar208,auVar181);
  auVar47 = vfmadd231sd_avx512f(auVar47,auVar202,auVar190);
  local_51e0._0_8_ = auVar47._0_8_;
  auVar44 = vfmadd231sd_fma(auVar44,auVar47,auVar46);
  auVar46 = vmulsd_avx512f(auVar208,auVar196);
  auVar46 = vfmadd231sd_avx512f(auVar46,auVar186,auVar190);
  local_5320 = auVar46._0_8_;
  auVar44 = vfmadd231sd_fma(auVar44,auVar46,auVar45);
  local_4fc0 = vunpcklpd_avx(auVar54,auVar44);
  lVar41 = 0;
  memset(local_4c80,0,0x480);
  auVar74._8_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar74._0_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar54 = *(undefined1 (*) [16])
             (pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
             m_data.array;
  auVar46 = vmulpd_avx512vl(auVar54,auVar74);
  auVar85._8_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar85._0_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar44 = *(undefined1 (*) [16])
             ((pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 3);
  auVar45 = vfmadd231pd_avx512vl(auVar46,auVar85,auVar44);
  auVar101._8_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar101._0_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar46 = *(undefined1 (*) [16])
             ((pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 6);
  auVar47 = vfmadd231pd_avx512vl(auVar45,auVar101,auVar46);
  auVar114._8_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar114._0_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar45 = *(undefined1 (*) [16])
             ((pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 9);
  auVar49 = vfmadd231pd_avx512vl(auVar47,auVar114,auVar45);
  auVar129._8_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar129._0_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar47 = *(undefined1 (*) [16])
             ((pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0xc);
  auVar48 = vfmadd231pd_avx512vl(auVar49,auVar129,auVar47);
  auVar136._8_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar136._0_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar49 = *(undefined1 (*) [16])
             ((pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0xf);
  auVar50 = vfmadd231pd_avx512vl(auVar48,auVar136,auVar49);
  auVar146._8_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar146._0_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar48 = *(undefined1 (*) [16])
             ((pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0x12);
  auVar51 = vfmadd231pd_avx512vl(auVar50,auVar146,auVar48);
  auVar154._8_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar154._0_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar50 = *(undefined1 (*) [16])
             ((pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0x15);
  local_5280 = vfmadd231pd_avx512vl(auVar51,auVar154,auVar50);
  auVar191._8_8_ = 0;
  auVar191._0_8_ =
       (pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[2];
  auVar51 = vmulsd_avx512f(auVar74,auVar191);
  auVar197._8_8_ = 0;
  auVar197._0_8_ =
       (pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[5];
  auVar52 = vmulsd_avx512f(auVar85,auVar197);
  auVar51 = vaddsd_avx512f(auVar51,auVar52);
  auVar203._8_8_ = 0;
  auVar203._0_8_ =
       (pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[8];
  auVar52 = vmulsd_avx512f(auVar101,auVar203);
  auVar209._8_8_ = 0;
  auVar209._0_8_ =
       (pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[0xb];
  auVar53 = vmulsd_avx512f(auVar114,auVar209);
  auVar52 = vaddsd_avx512f(auVar52,auVar53);
  auVar51 = vaddsd_avx512f(auVar51,auVar52);
  auVar215._8_8_ = 0;
  auVar215._0_8_ =
       (pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[0xe];
  auVar52 = vmulsd_avx512f(auVar129,auVar215);
  auVar221._8_8_ = 0;
  auVar221._0_8_ =
       (pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[0x11];
  auVar53 = vmulsd_avx512f(auVar136,auVar221);
  auVar52 = vaddsd_avx512f(auVar52,auVar53);
  auVar224._8_8_ = 0;
  auVar224._0_8_ =
       (pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[0x14];
  auVar53 = vmulsd_avx512f(auVar146,auVar224);
  auVar229._8_8_ = 0;
  auVar229._0_8_ =
       (pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[0x17];
  auVar55 = vmulsd_avx512f(auVar154,auVar229);
  auVar53 = vaddsd_avx512f(auVar53,auVar55);
  auVar52 = vaddsd_avx512f(auVar52,auVar53);
  auVar51 = vaddsd_avx512f(auVar51,auVar52);
  vmovsd_avx512f(auVar51);
  puVar38 = local_5080;
  do {
    dVar106 = local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
              m_data.array[lVar41];
    lVar43 = 0;
    do {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *(ulong *)(local_5280 + lVar43 * 8);
      auVar233._8_8_ = 0;
      auVar233._0_8_ = dVar106;
      auVar51 = vmulsd_avx512f(auVar233,auVar11);
      vmovsd_avx512f(auVar51);
      *(undefined8 *)(puVar38 + lVar43 * 8) = *(undefined8 *)(puVar38 + lVar43 * 8);
      lVar43 = lVar43 + 1;
    } while (lVar43 != 3);
    lVar41 = lVar41 + 1;
    puVar38 = puVar38 + 0x18;
  } while (lVar41 != 8);
  puVar38 = local_5080;
  local_4c80[0] = (double)local_5080._0_8_;
  local_4c80[1] = (double)local_5080._8_8_;
  local_4c80[2] = (double)local_5080._16_8_;
  local_4c80[3] = (double)local_5080._24_8_;
  local_4c80[4] = (double)local_5080._32_8_;
  uStack_4c58 = local_5080._40_8_;
  uStack_4c50 = local_5080._48_8_;
  uStack_4c48 = local_5080._56_8_;
  local_4c40 = local_5040._0_8_;
  uStack_4c38 = local_5040._8_8_;
  uStack_4c30 = local_5040._16_8_;
  uStack_4c28 = local_5040._24_8_;
  uStack_4c20 = local_5040._32_8_;
  uStack_4c18 = local_5040._40_8_;
  uStack_4c10 = local_5040._48_8_;
  uStack_4c08 = local_5040._56_8_;
  local_4c00 = local_5000._0_8_;
  uStack_4bf8 = local_5000._8_8_;
  uStack_4bf0 = local_5000._16_8_;
  uStack_4be8 = local_5000._24_8_;
  uStack_4be0 = local_5000._32_8_;
  uStack_4bd8 = local_5000._40_8_;
  uStack_4bd0 = local_5000._48_8_;
  uStack_4bc8 = local_5000._56_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_51c8._8_8_;
  auVar51 = vmovddup_avx512vl(auVar12);
  auVar54 = vmulpd_avx512vl(auVar54,auVar51);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dStack_51b8;
  auVar52 = vmovddup_avx512vl(auVar13);
  auVar54 = vfmadd213pd_avx512vl(auVar44,auVar52,auVar54);
  auVar168._8_8_ = dStack_51b0;
  auVar168._0_8_ = dStack_51b0;
  auVar54 = vfmadd213pd_fma(auVar46,auVar168,auVar54);
  auVar162._8_8_ = dStack_51a8;
  auVar162._0_8_ = dStack_51a8;
  auVar54 = vfmadd213pd_fma(auVar45,auVar162,auVar54);
  auVar173._8_8_ = dStack_51a0;
  auVar173._0_8_ = dStack_51a0;
  auVar54 = vfmadd213pd_fma(auVar47,auVar173,auVar54);
  auVar178._8_8_ = dStack_5198;
  auVar178._0_8_ = dStack_5198;
  auVar54 = vfmadd213pd_fma(auVar49,auVar178,auVar54);
  auVar182._8_8_ = dStack_5190;
  auVar182._0_8_ = dStack_5190;
  auVar54 = vfmadd213pd_fma(auVar48,auVar182,auVar54);
  auVar184._8_8_ = uStack_5188;
  auVar184._0_8_ = uStack_5188;
  local_5280 = vfmadd213pd_fma(auVar50,auVar184,auVar54);
  auVar54 = vmulsd_avx512f(auVar191,auVar51);
  auVar44 = vmulsd_avx512f(auVar197,auVar52);
  auVar54 = vaddsd_avx512f(auVar54,auVar44);
  auVar44 = vmulsd_avx512f(auVar203,auVar168);
  auVar46 = vmulsd_avx512f(auVar209,auVar162);
  auVar45 = vmulsd_avx512f(auVar215,auVar173);
  auVar47 = vmulsd_avx512f(auVar221,auVar178);
  auVar49 = vmulsd_avx512f(auVar224,auVar182);
  auVar48 = vmulsd_avx512f(auVar229,auVar184);
  local_5270 = auVar54._0_8_ + auVar44._0_8_ + auVar46._0_8_ +
               auVar45._0_8_ + auVar47._0_8_ + auVar49._0_8_ + auVar48._0_8_;
  lVar41 = 0;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = local_53a0._0_8_;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = local_5330._0_8_;
  do {
    dVar106 = *(double *)(local_51c8 + lVar41 * 8 + 8);
    lVar43 = 0;
    do {
      *(double *)(puVar38 + lVar43 * 8) = dVar106 * *(double *)(local_5280 + lVar43 * 8);
      lVar43 = lVar43 + 1;
    } while (lVar43 != 3);
    lVar41 = lVar41 + 1;
    puVar38 = puVar38 + 0x18;
  } while (lVar41 != 8);
  puVar38 = local_5080;
  local_4bc0[0] = (double)local_5080._0_8_;
  local_4bc0[1] = (double)local_5080._8_8_;
  local_4bc0[2] = (double)local_5080._16_8_;
  local_4bc0[3] = (double)local_5080._24_8_;
  local_4bc0[4] = (double)local_5080._32_8_;
  local_4bc0[5] = (double)local_5080._40_8_;
  local_4bc0[6] = (double)local_5080._48_8_;
  local_4bc0[7] = (double)local_5080._56_8_;
  local_4bc0[8] = (double)local_5040._0_8_;
  local_4bc0[9] = (double)local_5040._8_8_;
  local_4bc0[10] = (double)local_5040._16_8_;
  local_4bc0[0xb] = (double)local_5040._24_8_;
  local_4bc0[0xc] = (double)local_5040._32_8_;
  local_4bc0[0xd] = (double)local_5040._40_8_;
  local_4bc0[0xe] = (double)local_5040._48_8_;
  local_4bc0[0xf] = (double)local_5040._56_8_;
  local_4bc0[0x10] = (double)local_5000._0_8_;
  local_4bc0[0x11] = (double)local_5000._8_8_;
  local_4bc0[0x12] = (double)local_5000._16_8_;
  local_4bc0[0x13] = (double)local_5000._24_8_;
  local_4bc0[0x14] = (double)local_5000._32_8_;
  local_4bc0[0x15] = (double)local_5000._40_8_;
  local_4bc0[0x16] = (double)local_5000._48_8_;
  local_4bc0[0x17] = (double)local_5000._56_8_;
  auVar163._0_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0] *
       (pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[0];
  auVar163._8_8_ =
       local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0] *
       (pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[1];
  auVar54 = vfmadd231pd_fma(auVar163,auVar85,
                            *(undefined1 (*) [16])
                             ((pCVar28->m_d).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 3));
  auVar54 = vfmadd231pd_fma(auVar54,auVar101,
                            *(undefined1 (*) [16])
                             ((pCVar28->m_d).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 6));
  auVar54 = vfmadd231pd_fma(auVar54,auVar114,
                            *(undefined1 (*) [16])
                             ((pCVar28->m_d).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 9));
  auVar54 = vfmadd231pd_fma(auVar54,auVar129,
                            *(undefined1 (*) [16])
                             ((pCVar28->m_d).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0xc));
  auVar54 = vfmadd231pd_fma(auVar54,auVar136,
                            *(undefined1 (*) [16])
                             ((pCVar28->m_d).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0xf));
  auVar54 = vfmadd231pd_fma(auVar54,auVar146,
                            *(undefined1 (*) [16])
                             ((pCVar28->m_d).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0x12));
  local_4f90 = vfmadd231pd_fma(auVar54,auVar154,
                               *(undefined1 (*) [16])
                                ((pCVar28->m_d).
                                 super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                                 m_storage.m_data.array + 0x15));
  local_4f80 = local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[0] *
               (pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
               .m_data.array[2] +
               local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[1] *
               (pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
               .m_data.array[5] +
               local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[2] *
               (pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
               .m_data.array[8] +
               local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[3] *
               (pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
               .m_data.array[0xb] +
               local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[4] *
               (pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
               .m_data.array[0xe] +
               local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[5] *
               (pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
               .m_data.array[0x11] +
               local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[6] *
               (pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
               .m_data.array[0x14] +
               local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[7] *
               (pCVar28->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
               .m_data.array[0x17];
  lVar41 = 0;
  do {
    auVar75._8_8_ = 0;
    auVar75._0_8_ =
         local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
         array[lVar41];
    dVar106 = *(double *)(local_51c8 + lVar41 * 8 + 8);
    lVar43 = 0;
    do {
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *(ulong *)(local_5280 + lVar43 * 8);
      auVar102._8_8_ = 0;
      auVar102._0_8_ = dVar106 * *(double *)(local_4f90 + lVar43 * 8);
      auVar54 = vfmadd231sd_fma(auVar102,auVar75,auVar14);
      *(long *)(puVar38 + lVar43 * 8) = auVar54._0_8_;
      lVar43 = lVar43 + 1;
    } while (lVar43 != 3);
    lVar41 = lVar41 + 1;
    puVar38 = puVar38 + 0x18;
  } while (lVar41 != 8);
  local_4b00[0] = (double)local_5080._0_8_;
  local_4b00[1] = (double)local_5080._8_8_;
  local_4b00[2] = (double)local_5080._16_8_;
  local_4b00[3] = (double)local_5080._24_8_;
  local_4b00[4] = (double)local_5080._32_8_;
  local_4b00[5] = (double)local_5080._40_8_;
  local_4b00[6] = (double)local_5080._48_8_;
  local_4b00[7] = (double)local_5080._56_8_;
  local_4b00[8] = (double)local_5040._0_8_;
  local_4b00[9] = (double)local_5040._8_8_;
  local_4b00[10] = (double)local_5040._16_8_;
  local_4b00[0xb] = (double)local_5040._24_8_;
  local_4b00[0xc] = (double)local_5040._32_8_;
  local_4b00[0xd] = (double)local_5040._40_8_;
  local_4b00[0xe] = (double)local_5040._48_8_;
  local_4b00[0xf] = (double)local_5040._56_8_;
  local_4b00[0x10] = (double)local_5000._0_8_;
  local_4b00[0x11] = (double)local_5000._8_8_;
  local_4b00[0x12] = (double)local_5000._16_8_;
  local_4b00[0x13] = (double)local_5000._24_8_;
  local_4b00[0x14] = (double)local_5000._32_8_;
  local_4b00[0x15] = (double)local_5000._40_8_;
  local_4b00[0x16] = (double)local_5000._48_8_;
  local_4b00[0x17] = (double)local_5000._56_8_;
  local_5080 = ZEXT864(0) << 0x40;
  local_5040 = local_5080;
  local_5000 = local_5080;
  pdVar39 = (pCVar28->m_strainANS_D).super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>.
            m_storage.m_data.array + 0x10;
  lVar41 = 0;
  do {
    if (((ulong)pCVar28 & 0x3f) != 0) {
      __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                    ,"/usr/include/eigen3/Eigen/src/Core/CoreEvaluators.h",0x4ca,
                    "Eigen::internal::block_evaluator<Eigen::Matrix<double, 8, 24, 1>, 1, 24, true>::block_evaluator(const XprType &) [ArgType = Eigen::Matrix<double, 8, 24, 1>, BlockRows = 1, BlockCols = 24, InnerPanel = true, HasDirectAccess = true]"
                   );
    }
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *(ulong *)((long)local_5140 + lVar41);
    auVar65 = vbroadcastsd_avx512f(auVar15);
    auVar67 = vmulpd_avx512f(auVar65,*(undefined1 (*) [64])
                                      ((plain_array<double,_192,_1,_64> *)(pdVar39 + -0x10))->array)
    ;
    local_5080 = vaddpd_avx512f(local_5080,auVar67);
    auVar67 = vmulpd_avx512f(auVar65,*(undefined1 (*) [64])(pdVar39 + -8));
    local_5040 = vaddpd_avx512f(local_5040,auVar67);
    auVar65 = vmulpd_avx512f(auVar65,*(undefined1 (*) [64])pdVar39);
    local_5000 = vaddpd_avx512f(local_5000,auVar65);
    lVar41 = lVar41 + 0x10;
    pdVar39 = pdVar39 + 0x18;
  } while (lVar41 != 0x40);
  local_4a40 = local_5080;
  local_4a00 = local_5040;
  local_49c0 = local_5000;
  local_5040 = ZEXT864(0) << 0x40;
  local_5000 = local_5040;
  local_5080 = local_5040;
  pdVar39 = (pCVar28->m_strainANS_D).super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>.
            m_storage.m_data.array + 0xa0;
  lVar41 = 2;
  local_4940 = local_5040;
  local_4900 = local_5040;
  do {
    auVar16._8_8_ = 0;
    auVar16._0_8_ = (&local_5260)[lVar41];
    auVar65 = vbroadcastsd_avx512f(auVar16);
    auVar67 = vmulpd_avx512f(auVar65,*(undefined1 (*) [64])(pdVar39 + -0x10));
    local_5040 = vaddpd_avx512f(local_5040,auVar67);
    auVar67 = vmulpd_avx512f(auVar65,*(undefined1 (*) [64])(pdVar39 + -8));
    local_4940 = vaddpd_avx512f(local_4940,auVar67);
    auVar65 = vmulpd_avx512f(auVar65,*(undefined1 (*) [64])pdVar39);
    local_4900 = vaddpd_avx512f(local_4900,auVar65);
    lVar41 = lVar41 + 1;
    pdVar39 = pdVar39 + 0x18;
  } while (lVar41 == 3);
  local_4980 = local_5040;
  local_5080 = ZEXT864(0) << 0x40;
  local_5040 = local_5080;
  local_5000 = local_5080;
  pdVar39 = (pCVar28->m_strainANS_D).super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>.
            m_storage.m_data.array + 0x70;
  lVar41 = 0;
  do {
    auVar17._8_8_ = 0;
    auVar17._0_8_ = (&local_5260)[lVar41];
    auVar65 = vbroadcastsd_avx512f(auVar17);
    auVar67 = vmulpd_avx512f(auVar65,*(undefined1 (*) [64])(pdVar39 + -0x10));
    local_5080 = vaddpd_avx512f(local_5080,auVar67);
    auVar67 = vmulpd_avx512f(auVar65,*(undefined1 (*) [64])(pdVar39 + -8));
    local_5040 = vaddpd_avx512f(local_5040,auVar67);
    auVar65 = vmulpd_avx512f(auVar65,*(undefined1 (*) [64])pdVar39);
    local_5000 = vaddpd_avx512f(local_5000,auVar65);
    lVar41 = lVar41 + 1;
    pdVar39 = pdVar39 + 0x18;
  } while (lVar41 == 1);
  local_48c0 = local_5080;
  local_4880 = local_5040;
  local_4840 = local_5000;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uStack_4c58;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = local_52d0;
  auVar54 = vmulsd_avx512f(auVar204,auVar18);
  lVar41 = 0;
  do {
    dVar106 = local_4c80[lVar41];
    auVar130._8_8_ = 0;
    auVar130._0_8_ = dVar106;
    dVar68 = local_4bc0[lVar41];
    auVar137._8_8_ = 0;
    auVar137._0_8_ = dVar68;
    auVar198._8_8_ = 0;
    auVar198._0_8_ = local_52c0._0_8_;
    auVar44 = vmulsd_avx512f(auVar198,auVar137);
    auVar44 = vmulsd_avx512f(auVar198,auVar44);
    auVar86._8_8_ = 0;
    auVar86._0_8_ = (double)local_53a0._0_8_ * dVar106;
    auVar44 = vfmadd231sd_fma(auVar44,auVar185,auVar86);
    dVar79 = local_4b00[lVar41];
    auVar87._8_8_ = 0;
    auVar87._0_8_ = dVar79;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = (double)local_53a0._0_8_ * dVar79;
    auVar199._8_8_ = 0;
    auVar199._0_8_ = local_52c0._0_8_;
    auVar44 = vfmadd213sd_avx512f(auVar115,auVar199,auVar44);
    dVar80 = *(double *)(local_4a40 + lVar41 * 8);
    auVar147._8_8_ = 0;
    auVar147._0_8_ = dVar80;
    auVar210._8_8_ = 0;
    auVar210._0_8_ = local_5340;
    auVar46 = vmulsd_avx512f(auVar210,auVar147);
    auVar44 = vfmadd213sd_avx512f(auVar46,auVar210,auVar44);
    dVar69 = *(double *)(local_4980 + lVar41 * 8);
    auVar103._8_8_ = 0;
    auVar103._0_8_ = dVar69;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = (double)local_53a0._0_8_ * dVar69;
    auVar211._8_8_ = 0;
    auVar211._0_8_ = local_5340;
    auVar44 = vfmadd213sd_avx512f(auVar164,auVar211,auVar44);
    auVar116._8_8_ = 0;
    auVar116._0_8_ = *(ulong *)(local_48c0 + lVar41 * 8);
    auVar46 = vmulsd_avx512f(auVar199,auVar116);
    auVar44 = vfmadd213sd_avx512f(auVar46,auVar211,auVar44);
    local_46c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.array
    [lVar41] = auVar44._0_8_;
    auVar225._8_8_ = 0;
    auVar225._0_8_ = local_5350;
    auVar44 = vmulsd_avx512f(auVar225,auVar137);
    auVar44 = vmulsd_avx512f(auVar225,auVar44);
    auVar155._8_8_ = 0;
    auVar155._0_8_ = (double)local_5330._0_8_ * dVar106;
    auVar44 = vfmadd231sd_fma(auVar44,auVar187,auVar155);
    auVar156._8_8_ = 0;
    auVar156._0_8_ = (double)local_5330._0_8_ * dVar79;
    auVar226._8_8_ = 0;
    auVar226._0_8_ = local_5350;
    auVar44 = vfmadd213sd_avx512f(auVar156,auVar226,auVar44);
    auVar216._8_8_ = 0;
    auVar216._0_8_ = local_5358;
    auVar46 = vmulsd_avx512f(auVar216,auVar147);
    auVar44 = vfmadd213sd_avx512f(auVar46,auVar216,auVar44);
    auVar157._8_8_ = 0;
    auVar157._0_8_ = (double)local_5330._0_8_ * dVar69;
    auVar217._8_8_ = 0;
    auVar217._0_8_ = local_5358;
    auVar44 = vfmadd213sd_avx512f(auVar157,auVar217,auVar44);
    auVar46 = vmulsd_avx512f(auVar226,auVar116);
    auVar44 = vfmadd213sd_avx512f(auVar46,auVar217,auVar44);
    *(long *)(local_4240 + lVar41 * 8 + -0x3c0) = auVar44._0_8_;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = dVar68 + dVar68;
    auVar46 = vmulsd_avx512f(auVar199,auVar169);
    auVar44 = vmulsd_avx512f(auVar226,auVar46);
    auVar165._8_8_ = 0;
    auVar165._0_8_ = (double)local_53a0._0_8_ * (dVar106 + dVar106);
    auVar44 = vfmadd231sd_fma(auVar44,auVar165,auVar187);
    auVar230._8_8_ = 0;
    auVar230._0_8_ = local_52a0._0_8_;
    auVar44 = vfmadd231sd_avx512f(auVar44,auVar87,auVar230);
    auVar179._8_8_ = 0;
    auVar179._0_8_ = dVar80 + dVar80;
    auVar45 = vmulsd_avx512f(auVar211,auVar179);
    auVar44 = vfmadd231sd_avx512f(auVar44,auVar45,auVar217);
    auVar234._8_8_ = 0;
    auVar234._0_8_ = local_5308;
    auVar44 = vfmadd231sd_avx512f(auVar44,auVar103,auVar234);
    auVar235._8_8_ = 0;
    auVar235._0_8_ = local_5310;
    auVar44 = vfmadd231sd_avx512f(auVar44,auVar116,auVar235);
    *(long *)(local_4240 + lVar41 * 8 + -0x300) = auVar44._0_8_;
    auVar192._8_8_ = 0;
    auVar192._0_8_ = local_5380._0_8_;
    auVar44 = vmulsd_avx512f(auVar192,auVar130);
    auVar47 = vmulsd_avx512f(auVar204,auVar137);
    auVar205._8_8_ = 0;
    auVar205._0_8_ = local_52d0;
    auVar47 = vmulsd_avx512f(auVar205,auVar47);
    auVar44 = vfmadd231sd_avx512f(auVar47,auVar192,auVar44);
    auVar193._8_8_ = 0;
    auVar193._0_8_ = local_5380._0_8_;
    auVar47 = vmulsd_avx512f(auVar193,auVar87);
    auVar44 = vfmadd213sd_avx512f(auVar47,auVar205,auVar44);
    auVar222._8_8_ = 0;
    auVar222._0_8_ = local_5390;
    auVar47 = vmulsd_avx512f(auVar222,auVar147);
    auVar44 = vfmadd213sd_avx512f(auVar47,auVar222,auVar44);
    auVar47 = vmulsd_avx512f(auVar193,auVar103);
    auVar223._8_8_ = 0;
    auVar223._0_8_ = local_5390;
    auVar44 = vfmadd213sd_avx512f(auVar47,auVar223,auVar44);
    auVar44 = vfmadd231sd_avx512f(auVar44,auVar54,auVar223);
    *(long *)(local_4240 + lVar41 * 8 + -0x240) = auVar44._0_8_;
    auVar44 = vmulsd_avx512f(auVar205,auVar46);
    auVar44 = vfmadd231sd_avx512f(auVar44,auVar193,auVar165);
    auVar236._8_8_ = 0;
    auVar236._0_8_ = local_5368;
    auVar44 = vfmadd231sd_avx512f(auVar44,auVar87,auVar236);
    auVar44 = vfmadd231sd_avx512f(auVar44,auVar223,auVar45);
    auVar237._8_8_ = 0;
    auVar237._0_8_ = local_5318;
    auVar44 = vfmadd231sd_avx512f(auVar44,auVar103,auVar237);
    auVar238._8_8_ = 0;
    auVar238._0_8_ = local_52f0;
    auVar44 = vfmadd231sd_avx512f(auVar44,auVar116,auVar238);
    *(long *)(local_4240 + lVar41 * 8 + -0x180) = auVar44._0_8_;
    auVar44 = vmulsd_avx512f(auVar226,auVar169);
    auVar44 = vmulsd_avx512f(auVar205,auVar44);
    auVar131._8_8_ = 0;
    auVar131._0_8_ = (double)local_5330._0_8_ * (dVar106 + dVar106);
    auVar44 = vfmadd231sd_avx512f(auVar44,auVar193,auVar131);
    auVar239._8_8_ = 0;
    auVar239._0_8_ = local_5370;
    auVar44 = vfmadd231sd_avx512f(auVar44,auVar239,auVar87);
    auVar46 = vmulsd_avx512f(auVar217,auVar179);
    auVar44 = vfmadd213sd_avx512f(auVar46,auVar223,auVar44);
    auVar240._8_8_ = 0;
    auVar240._0_8_ = local_51e0._0_8_;
    auVar44 = vfmadd231sd_avx512f(auVar44,auVar240,auVar103);
    auVar241._8_8_ = 0;
    auVar241._0_8_ = local_5320;
    auVar44 = vfmadd231sd_avx512f(auVar44,auVar241,auVar116);
    *(long *)(local_4240 + lVar41 * 8 + -0xc0) = auVar44._0_8_;
    lVar41 = lVar41 + 1;
  } while (lVar41 != 0x18);
  lVar41 = 0;
  memset(pdVar42,0,0x6c0);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = local_5360;
  do {
    auVar76._8_8_ = 0;
    auVar76._0_8_ =
         local_5180.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
         array[lVar41];
    dVar106 = *(double *)(local_51c8 + lVar41 * 8 + 8);
    auVar104._8_8_ = 0;
    auVar104._0_8_ = (double)local_5230._0_8_ * dVar106;
    auVar54 = vfmadd231sd_fma(auVar104,local_51f0,auVar76);
    auVar117._8_8_ = 0;
    auVar117._0_8_ =
         local_4cc0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
         array[lVar41];
    auVar54 = vfmadd231sd_fma(auVar54,local_5210,auVar117);
    dVar68 = auVar54._0_8_;
    *pdVar42 = dVar68;
    pdVar42[0x19] = dVar68;
    pdVar42[0x32] = dVar68;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = (double)local_5200._0_8_ * dVar106;
    auVar54 = vfmadd231sd_fma(auVar105,local_4fa0,auVar76);
    auVar54 = vfmadd231sd_fma(auVar54,local_5220,auVar117);
    dVar68 = auVar54._0_8_;
    pdVar42[0x48] = dVar68;
    pdVar42[0x61] = dVar68;
    pdVar42[0x7a] = dVar68;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = (double)local_52b0._0_8_ * dVar106;
    auVar54 = vfmadd231sd_fma(auVar88,local_52e0,auVar76);
    auVar54 = vfmadd231sd_fma(auVar54,auVar176,auVar117);
    dVar106 = auVar54._0_8_;
    pdVar42[0x90] = dVar106;
    pdVar42[0xa9] = dVar106;
    pdVar42[0xc2] = dVar106;
    lVar41 = lVar41 + 1;
    pdVar42 = pdVar42 + 3;
  } while (lVar41 != 8);
  auVar54 = ZEXT816(0) << 0x40;
  lVar41 = 0;
  auVar44 = ZEXT816(0) << 0x40;
  auVar46 = ZEXT816(0) << 0x40;
  do {
    auVar118._8_8_ = 0;
    auVar118._0_8_ =
         (pCVar28->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
         m_data.array[lVar41];
    auVar45 = vshufpd_avx(auVar54,auVar54,1);
    auVar19._8_8_ = 0;
    auVar19._0_8_ =
         local_46c0.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
         array[lVar41];
    auVar54 = vfmadd231sd_fma(auVar54,auVar118,auVar19);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = *(ulong *)(local_4240 + lVar41 * 8 + -0x3c0);
    auVar45 = vfmadd231sd_fma(auVar45,auVar118,auVar20);
    auVar54 = vunpcklpd_avx(auVar54,auVar45);
    auVar45 = vshufpd_avx(auVar44,auVar44,1);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = *(ulong *)(local_4240 + lVar41 * 8 + -0x300);
    auVar44 = vfmadd231sd_fma(auVar44,auVar118,auVar21);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = *(ulong *)(local_4240 + lVar41 * 8 + -0x240);
    auVar45 = vfmadd231sd_fma(auVar45,auVar118,auVar22);
    auVar44 = vunpcklpd_avx(auVar44,auVar45);
    auVar45 = vshufpd_avx(auVar46,auVar46,1);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *(ulong *)(local_4240 + lVar41 * 8 + -0x180);
    auVar46 = vfmadd231sd_fma(auVar46,auVar118,auVar23);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *(ulong *)(local_4240 + lVar41 * 8 + -0xc0);
    auVar45 = vfmadd231sd_fma(auVar45,auVar118,auVar24);
    auVar46 = vunpcklpd_avx(auVar46,auVar45);
    lVar41 = lVar41 + 1;
  } while (lVar41 != 0x18);
  dVar106 = pCVar28->m_Alpha;
  pLVar31 = (pCVar28->m_layers).
            super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar32 = pLVar31[this->m_kl].m_material.
            super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = pLVar31[this->m_kl].m_material.
            super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  dVar68 = auVar54._0_8_ * dVar106;
  dVar79 = auVar54._8_8_ * dVar106;
  dVar80 = auVar44._0_8_ * dVar106;
  dVar69 = auVar44._8_8_ * dVar106;
  dVar90 = auVar46._0_8_ * dVar106;
  dVar106 = auVar46._8_8_ * dVar106;
  dVar1 = (double)local_5300._0_8_ + local_4f70[0];
  dVar2 = (double)local_5300._8_8_ + local_4f70[1];
  dVar138 = (double)local_4fb0._0_8_ + local_4f70[2];
  dVar148 = (double)local_4fb0._8_8_ + local_4f70[3];
  dVar149 = (double)local_4fc0._0_8_ + local_4f70[4];
  dVar158 = (double)local_4fc0._8_8_ + local_4f70[5];
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_5390 = dVar68;
    dStack_5388 = dVar79;
    local_5350 = dVar80;
    dStack_5348 = dVar69;
    local_5340 = (double)local_4fc0._0_8_ + local_4f70[4];
    dStack_5338 = (double)local_4fc0._8_8_ + local_4f70[5];
    local_5330._0_8_ = dVar90;
    local_5330._8_8_ = dVar106;
    local_5380._0_8_ = (double)local_4fb0._0_8_ + local_4f70[2];
    local_5380._8_8_ = (double)local_4fb0._8_8_ + local_4f70[3];
    local_53a0._0_8_ = (double)local_5300._0_8_ + local_4f70[0];
    local_53a0._8_8_ = (double)local_5300._8_8_ + local_4f70[1];
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    dVar68 = local_5390;
    dVar79 = dStack_5388;
    dVar80 = local_5350;
    dVar69 = dStack_5348;
    dVar90 = (double)local_5330._0_8_;
    dVar106 = (double)local_5330._8_8_;
    dVar1 = (double)local_53a0._0_8_;
    dVar2 = (double)local_53a0._8_8_;
    dVar138 = (double)local_5380._0_8_;
    dVar148 = (double)local_5380._8_8_;
    dVar149 = local_5340;
    dVar158 = dStack_5338;
  }
  local_4df0._16_8_ = &peVar32->m_E_eps;
  pdVar39 = (double *)((long)&peVar32->m_E_eps + 0x20);
  lVar41 = 0;
  do {
    dVar107 = (dVar1 + dVar68) * ((plain_array<double,_36,_1,_32> *)(pdVar39 + -4))->array[0] +
              (dVar138 + dVar80) * pdVar39[-2] + (dVar149 + dVar90) * *pdVar39;
    dVar120 = (dVar2 + dVar79) * pdVar39[-3] +
              (dVar148 + dVar69) * pdVar39[-1] + (dVar158 + dVar106) * pdVar39[1];
    auVar119._0_8_ = dVar107 + dVar120;
    auVar119._8_8_ = dVar107 + dVar120;
    dVar107 = (double)vmovlpd_avx(auVar119);
    local_50b0[lVar41] = dVar107;
    lVar41 = lVar41 + 1;
    pdVar39 = pdVar39 + 6;
  } while (lVar41 != 6);
  memset(&local_3008,0,0x288);
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array[0]
       = local_50b0[0];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array[10]
       = local_50b0[0];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x14] = local_50b0[0];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array[3]
       = local_50b0[2];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0xd] = local_50b0[2];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x17] = local_50b0[2];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array[6]
       = local_50b0[4];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x10] = local_50b0[4];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x1a] = local_50b0[4];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x1b] = local_50b0[2];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x25] = local_50b0[2];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x2f] = local_50b0[2];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x1e] = local_50b0[1];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x28] = local_50b0[1];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x32] = local_50b0[1];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x21] = local_50b0[5];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x2b] = local_50b0[5];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x35] = local_50b0[5];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x36] = local_50b0[4];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x40] = local_50b0[4];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x4a] = local_50b0[4];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x39] = local_50b0[5];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x43] = local_50b0[5];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x4d] = local_50b0[5];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x3c] = local_50b0[3];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x46] = local_50b0[3];
  local_3008.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x50] = local_50b0[3];
  local_4d98 = this->m_Kfactor;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = local_4d98;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = this->m_Rfactor;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = this->m_element->m_Alpha;
  auVar54 = vfmadd132sd_fma(auVar89,auVar77,auVar25);
  local_53a0._0_8_ = local_4df0._16_8_;
  local_4dc8 = auVar54._0_8_;
  local_4db8.m_lhs.m_matrix = &local_2d80;
  local_4df0._8_8_ = &local_46c0;
  local_4df0._24_8_ = &local_46c0;
  local_4db8.m_rhs = &local_3008;
  local_4da8 = local_4db8.m_lhs.m_matrix;
  local_2640 = &local_2600;
  memset(&local_2600,0,0x1200);
  local_4240._0_8_ = (DstEvaluatorType *)0x3ff0000000000000;
  Eigen::internal::
  generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,24,1,6,24>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,24,1,6,24>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,24,24,1,24,24>>
            (&local_2600,
             (Product<Eigen::Transpose<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>
              *)(local_4df0 + 8),&local_46c0,(Scalar *)local_4240);
  a_rhs = local_4da8;
  local_1400 = local_4dc8;
  local_1380 = &local_1340;
  memset(&local_1340,0,0x1200);
  local_4240._0_8_ = 0x3ff0000000000000;
  Eigen::internal::
  generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,9,24,1,9,24>>,Eigen::Matrix<double,9,9,1,9,9>,0>,Eigen::Matrix<double,9,24,1,9,24>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,24,24,1,24,24>>
            (&local_1340,&local_4db8,a_rhs,(Scalar *)local_4240);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_4d98;
  auVar65 = vbroadcastsd_avx512f(auVar26);
  local_140 = vmovlpd_avx(auVar65._0_16_);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_1400;
  auVar67 = vbroadcastsd_avx512f(auVar27);
  lVar41 = 0x80;
  do {
    auVar63 = vmulpd_avx512f(auVar67,*(undefined1 (*) [64])
                                      ((long)(local_2640->
                                             super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                             ).m_storage.m_data.array + lVar41 + -0x80));
    auVar66 = vmulpd_avx512f(auVar65,*(undefined1 (*) [64])
                                      ((long)(local_1380->
                                             super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                             ).m_storage.m_data.array + lVar41 + -0x80));
    auVar63 = vaddpd_avx512f(auVar63,auVar66);
    *(undefined1 (*) [64])(local_4240 + lVar41 + -0x80) = auVar63;
    auVar63 = vmulpd_avx512f(auVar67,*(undefined1 (*) [64])
                                      ((long)(local_2640->
                                             super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                             ).m_storage.m_data.array + lVar41 + -0x40));
    auVar66 = vmulpd_avx512f(auVar65,*(undefined1 (*) [64])
                                      ((long)(local_1380->
                                             super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                             ).m_storage.m_data.array + lVar41 + -0x40));
    auVar63 = vaddpd_avx512f(auVar63,auVar66);
    *(undefined1 (*) [64])(local_4240 + lVar41 + -0x40) = auVar63;
    auVar63 = vmulpd_avx512f(auVar67,*(undefined1 (*) [64])
                                      ((long)(local_2640->
                                             super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                             ).m_storage.m_data.array + lVar41));
    auVar66 = vmulpd_avx512f(auVar65,*(undefined1 (*) [64])
                                      ((long)(local_1380->
                                             super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                             ).m_storage.m_data.array + lVar41));
    auVar63 = vaddpd_avx512f(auVar63,auVar66);
    *(undefined1 (*) [64])(local_4240 + lVar41) = auVar63;
    lVar41 = lVar41 + 0xc0;
  } while (lVar41 != 0x1280);
  local_4df0._0_8_ = local_5290 * this->m_element->m_GaussScaling;
  local_26c0._8_8_ = local_4df0;
  local_26c0._0_8_ = local_51c8;
  local_26c0._16_8_ = &local_53a1;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = local_4df0._0_8_;
  auVar65 = vbroadcastsd_avx512f(auVar78);
  local_4240._0_64_ = vmulpd_avx512f(auVar65,local_4240._0_64_);
  local_4240._64_64_ = vmulpd_avx512f(auVar65,local_4240._64_64_);
  local_41c0 = vmulpd_avx512f(auVar65,local_41c0);
  local_4180 = vmulpd_avx512f(auVar65,local_4180);
  local_4140 = vmulpd_avx512f(auVar65,local_4140);
  local_4100 = vmulpd_avx512f(auVar65,local_4100);
  local_40c0 = vmulpd_avx512f(auVar65,local_40c0);
  local_4080 = vmulpd_avx512f(auVar65,local_4080);
  local_4040 = vmulpd_avx512f(auVar65,local_4040);
  local_4000 = vmulpd_avx512f(auVar65,local_4000);
  local_3fc0 = vmulpd_avx512f(auVar65,local_3fc0);
  local_3f80 = vmulpd_avx512f(auVar65,local_3f80);
  local_3f40 = vmulpd_avx512f(auVar65,local_3f40);
  local_3f00 = vmulpd_avx512f(auVar65,local_3f00);
  local_51c8._0_8_ = (DstXprType *)local_4240;
  local_26c0._24_8_ = (DstXprType *)local_4240;
  Eigen::internal::
  copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_112,_576>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
         *)local_26c0);
  local_4dd0.m_other = local_5290 * this->m_element->m_GaussScaling;
  local_4df0._0_8_ = &local_47b0;
  local_4df0._8_8_ = local_53a0._0_8_;
  local_4df0._16_8_ = &local_46c0;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,5,24,1,5,24>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,5,1,6,5>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,24,1,6,24>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,5,24,1,5,24>const>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,_5,_24,_1,_5,_24> *)local_26c0,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>,_Eigen::Matrix<double,_6,_24,_1,_6,_24>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_5,_24,_1,_5,_24>_>_>
              *)local_4df0,(assign_op<double,_double> *)local_51c8);
  pCVar37 = local_51d0;
  memcpy(local_51d0,(DstXprType *)local_4240,0x1200);
  memcpy((pCVar37->super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>).m_storage.
         m_data.array + 0x240,(Matrix<double,_5,_24,_1,_5,_24> *)local_26c0,0x3c0);
  return;
}

Assistant:

void ShellANCF_Jacobian::Evaluate(ChVectorN<double, 696>& result, const double x, const double y, const double z) {
    // Element shape function
    ChElementShellANCF_3423::ShapeVector N;
    m_element->ShapeFunctions(N, x, y, z);

    // Determinant of position vector gradient matrix: Initial configuration
    ChElementShellANCF_3423::ShapeVector Nx;
    ChElementShellANCF_3423::ShapeVector Ny;
    ChElementShellANCF_3423::ShapeVector Nz;
    ChMatrixNM<double, 1, 3> Nx_d0;
    ChMatrixNM<double, 1, 3> Ny_d0;
    ChMatrixNM<double, 1, 3> Nz_d0;
    double detJ0 = m_element->Calc_detJ0(x, y, z, Nx, Ny, Nz, Nx_d0, Ny_d0, Nz_d0);

    // ANS shape function
    ChMatrixNM<double, 1, 4> S_ANS;  // Shape function vector for Assumed Natural Strain
    ChMatrixNM<double, 6, 5> M;      // Shape function vector for Enhanced Assumed Strain
    m_element->ShapeFunctionANSbilinearShell(S_ANS, x, y);
    m_element->Basis_M(M, x, y, z);

    // Transformation : Orthogonal transformation (A and J)
    ChVector<double> G1xG2;  // Cross product of first and second column of
    double G1dotG1;          // Dot product of first column of position vector gradient

    G1xG2.x() = Nx_d0(1) * Ny_d0(2) - Nx_d0(2) * Ny_d0(1);
    G1xG2.y() = Nx_d0(2) * Ny_d0(0) - Nx_d0(0) * Ny_d0(2);
    G1xG2.z() = Nx_d0(0) * Ny_d0(1) - Nx_d0(1) * Ny_d0(0);
    G1dotG1 = Nx_d0(0) * Nx_d0(0) + Nx_d0(1) * Nx_d0(1) + Nx_d0(2) * Nx_d0(2);

    // Tangent Frame
    ChVector<double> A1;
    ChVector<double> A2;
    ChVector<double> A3;
    A1.x() = Nx_d0(0);
    A1.y() = Nx_d0(1);
    A1.z() = Nx_d0(2);
    A1 = A1 / sqrt(G1dotG1);
    A3 = G1xG2.GetNormalized();
    A2.Cross(A3, A1);

    // Direction for orthotropic material
    double theta = m_element->GetLayer(m_kl).Get_theta();  // Fiber angle
    ChVector<double> AA1;
    ChVector<double> AA2;
    ChVector<double> AA3;
    AA1 = A1 * cos(theta) + A2 * sin(theta);
    AA2 = -A1 * sin(theta) + A2 * cos(theta);
    AA3 = A3;

    /// Beta
    ChMatrixNM<double, 3, 3> j0;
    ChVector<double> j01;
    ChVector<double> j02;
    ChVector<double> j03;
    // Calculates inverse of rd0 (j0) (position vector gradient: Initial Configuration)
    j0(0, 0) = Ny_d0(1) * Nz_d0(2) - Nz_d0(1) * Ny_d0(2);
    j0(0, 1) = Ny_d0(2) * Nz_d0(0) - Ny_d0(0) * Nz_d0(2);
    j0(0, 2) = Ny_d0(0) * Nz_d0(1) - Nz_d0(0) * Ny_d0(1);
    j0(1, 0) = Nz_d0(1) * Nx_d0(2) - Nx_d0(1) * Nz_d0(2);
    j0(1, 1) = Nz_d0(2) * Nx_d0(0) - Nx_d0(2) * Nz_d0(0);
    j0(1, 2) = Nz_d0(0) * Nx_d0(1) - Nz_d0(1) * Nx_d0(0);
    j0(2, 0) = Nx_d0(1) * Ny_d0(2) - Ny_d0(1) * Nx_d0(2);
    j0(2, 1) = Ny_d0(0) * Nx_d0(2) - Nx_d0(0) * Ny_d0(2);
    j0(2, 2) = Nx_d0(0) * Ny_d0(1) - Ny_d0(0) * Nx_d0(1);
    j0 /= detJ0;

    j01[0] = j0(0, 0);
    j02[0] = j0(1, 0);
    j03[0] = j0(2, 0);
    j01[1] = j0(0, 1);
    j02[1] = j0(1, 1);
    j03[1] = j0(2, 1);
    j01[2] = j0(0, 2);
    j02[2] = j0(1, 2);
    j03[2] = j0(2, 2);

    // Coefficients of contravariant transformation
    ChVectorN<double, 9> beta;
    beta(0) = Vdot(AA1, j01);
    beta(1) = Vdot(AA2, j01);
    beta(2) = Vdot(AA3, j01);
    beta(3) = Vdot(AA1, j02);
    beta(4) = Vdot(AA2, j02);
    beta(5) = Vdot(AA3, j02);
    beta(6) = Vdot(AA1, j03);
    beta(7) = Vdot(AA2, j03);
    beta(8) = Vdot(AA3, j03);

    // Transformation matrix, function of fiber angle
    const ChMatrixNM<double, 6, 6>& T0 = m_element->GetLayer(m_kl).Get_T0();
    // Determinant of the initial position vector gradient at the element center
    double detJ0C = m_element->GetLayer(m_kl).Get_detJ0C();

    // Enhanced Assumed Strain
    ChMatrixNM<double, 6, 5> G = T0 * M * (detJ0C / detJ0);
    ChVectorN<double, 6> strain_EAS = G * m_element->m_alphaEAS[m_kl];

    ChVectorN<double, 8> ddNx = m_element->m_ddT * Nx.transpose();
    ChVectorN<double, 8> ddNy = m_element->m_ddT * Ny.transpose();

    ChVectorN<double, 8> d0d0Nx = m_element->m_d0d0T * Nx.transpose();
    ChVectorN<double, 8> d0d0Ny = m_element->m_d0d0T * Ny.transpose();

    // Strain component
    ChVectorN<double, 6> strain_til;
    strain_til(0) = 0.5 * ((Nx * ddNx)(0, 0) - (Nx * d0d0Nx)(0, 0));
    strain_til(1) = 0.5 * ((Ny * ddNy)(0, 0) - (Ny * d0d0Ny)(0, 0));
    strain_til(2) = (Nx * ddNy)(0, 0) - (Nx * d0d0Ny)(0, 0);
    strain_til(3) = N(0) * m_element->m_strainANS(0) + N(2) * m_element->m_strainANS(1) +
                    N(4) * m_element->m_strainANS(2) + N(6) * m_element->m_strainANS(3);
    strain_til(4) = S_ANS(0, 2) * m_element->m_strainANS(6) + S_ANS(0, 3) * m_element->m_strainANS(7);
    strain_til(5) = S_ANS(0, 0) * m_element->m_strainANS(4) + S_ANS(0, 1) * m_element->m_strainANS(5);

    // For orthotropic material
    ChVectorN<double, 6> strain;

    strain(0) = strain_til(0) * beta(0) * beta(0) + strain_til(1) * beta(3) * beta(3) +
                strain_til(2) * beta(0) * beta(3) + strain_til(3) * beta(6) * beta(6) +
                strain_til(4) * beta(0) * beta(6) + strain_til(5) * beta(3) * beta(6);
    strain(1) = strain_til(0) * beta(1) * beta(1) + strain_til(1) * beta(4) * beta(4) +
                strain_til(2) * beta(1) * beta(4) + strain_til(3) * beta(7) * beta(7) +
                strain_til(4) * beta(1) * beta(7) + strain_til(5) * beta(4) * beta(7);
    strain(2) = strain_til(0) * 2.0 * beta(0) * beta(1) + strain_til(1) * 2.0 * beta(3) * beta(4) +
                strain_til(2) * (beta(1) * beta(3) + beta(0) * beta(4)) + strain_til(3) * 2.0 * beta(6) * beta(7) +
                strain_til(4) * (beta(1) * beta(6) + beta(0) * beta(7)) +
                strain_til(5) * (beta(4) * beta(6) + beta(3) * beta(7));
    strain(3) = strain_til(0) * beta(2) * beta(2) + strain_til(1) * beta(5) * beta(5) +
                strain_til(2) * beta(2) * beta(5) + strain_til(3) * beta(8) * beta(8) +
                strain_til(4) * beta(2) * beta(8) + strain_til(5) * beta(5) * beta(8);
    strain(4) = strain_til(0) * 2.0 * beta(0) * beta(2) + strain_til(1) * 2.0 * beta(3) * beta(5) +
                strain_til(2) * (beta(2) * beta(3) + beta(0) * beta(5)) + strain_til(3) * 2.0 * beta(6) * beta(8) +
                strain_til(4) * (beta(2) * beta(6) + beta(0) * beta(8)) +
                strain_til(5) * (beta(5) * beta(6) + beta(3) * beta(8));
    strain(5) = strain_til(0) * 2.0 * beta(1) * beta(2) + strain_til(1) * 2.0 * beta(4) * beta(5) +
                strain_til(2) * (beta(2) * beta(4) + beta(1) * beta(5)) + strain_til(3) * 2.0 * beta(7) * beta(8) +
                strain_til(4) * (beta(2) * beta(7) + beta(1) * beta(8)) +
                strain_til(5) * (beta(5) * beta(7) + beta(4) * beta(8));

    // Strain derivative component

    ChMatrixNM<double, 6, 24> strainD_til;
    strainD_til.setZero();

    ChMatrixNM<double, 1, 24> tempB;
    ChMatrixNM<double, 1, 3> tempB3;
    ChMatrixNM<double, 1, 3> tempB31;

    tempB3 = Nx * m_element->m_d;
    for (int i = 0; i < 8; i++) {
        for (int j = 0; j < 3; j++) {
            tempB(0, i * 3 + j) = tempB3(0, j) * Nx(0, i);
        }
    }
    strainD_til.row(0) = tempB;

    tempB3 = Ny * m_element->m_d;
    for (int i = 0; i < 8; i++) {
        for (int j = 0; j < 3; j++) {
            tempB(0, i * 3 + j) = tempB3(0, j) * Ny(0, i);
        }
    }
    strainD_til.row(1) = tempB;

    tempB31 = Nx * m_element->m_d;
    for (int i = 0; i < 8; i++) {
        for (int j = 0; j < 3; j++) {
            tempB(0, i * 3 + j) = tempB3(0, j) * Nx(0, i) + tempB31(0, j) * Ny(0, i);
        }
    }
    strainD_til.row(2) = tempB;

    tempB.setZero();
    for (int i = 0; i < 4; i++) {
        tempB += N(i * 2) * m_element->m_strainANS_D.row(i);
    }
    strainD_til.row(3) = tempB;  // strainD for zz

    tempB.setZero();
    for (int i = 0; i < 2; i++) {
        tempB += S_ANS(0, i + 2) * m_element->m_strainANS_D.row(i + 6);
    }
    strainD_til.row(4) = tempB;  // strainD for xz

    tempB.setZero();
    for (int i = 0; i < 2; i++) {
        tempB += S_ANS(0, i) * m_element->m_strainANS_D.row(i + 4);
    }
    strainD_til.row(5) = tempB;  // strainD for yz

    //// For orthotropic material
    ChMatrixNM<double, 6, 24> strainD;  // Derivative of the strains w.r.t. the coordinates. Includes orthotropy
    for (int ii = 0; ii < 24; ii++) {
        strainD(0, ii) = strainD_til(0, ii) * beta(0) * beta(0) + strainD_til(1, ii) * beta(3) * beta(3) +
                         strainD_til(2, ii) * beta(0) * beta(3) + strainD_til(3, ii) * beta(6) * beta(6) +
                         strainD_til(4, ii) * beta(0) * beta(6) + strainD_til(5, ii) * beta(3) * beta(6);
        strainD(1, ii) = strainD_til(0, ii) * beta(1) * beta(1) + strainD_til(1, ii) * beta(4) * beta(4) +
                         strainD_til(2, ii) * beta(1) * beta(4) + strainD_til(3, ii) * beta(7) * beta(7) +
                         strainD_til(4, ii) * beta(1) * beta(7) + strainD_til(5, ii) * beta(4) * beta(7);
        strainD(2, ii) = strainD_til(0, ii) * 2.0 * beta(0) * beta(1) + strainD_til(1, ii) * 2.0 * beta(3) * beta(4) +
                         strainD_til(2, ii) * (beta(1) * beta(3) + beta(0) * beta(4)) +
                         strainD_til(3, ii) * 2.0 * beta(6) * beta(7) +
                         strainD_til(4, ii) * (beta(1) * beta(6) + beta(0) * beta(7)) +
                         strainD_til(5, ii) * (beta(4) * beta(6) + beta(3) * beta(7));
        strainD(3, ii) = strainD_til(0, ii) * beta(2) * beta(2) + strainD_til(1, ii) * beta(5) * beta(5) +
                         strainD_til(2, ii) * beta(2) * beta(5) + strainD_til(3, ii) * beta(8) * beta(8) +
                         strainD_til(4, ii) * beta(2) * beta(8) + strainD_til(5) * beta(5) * beta(8);
        strainD(4, ii) = strainD_til(0, ii) * 2.0 * beta(0) * beta(2) + strainD_til(1, ii) * 2.0 * beta(3) * beta(5) +
                         strainD_til(2, ii) * (beta(2) * beta(3) + beta(0) * beta(5)) +
                         strainD_til(3, ii) * 2.0 * beta(6) * beta(8) +
                         strainD_til(4, ii) * (beta(2) * beta(6) + beta(0) * beta(8)) +
                         strainD_til(5, ii) * (beta(5) * beta(6) + beta(3) * beta(8));
        strainD(5, ii) = strainD_til(0, ii) * 2.0 * beta(1) * beta(2) + strainD_til(1, ii) * 2.0 * beta(4) * beta(5) +
                         strainD_til(2, ii) * (beta(2) * beta(4) + beta(1) * beta(5)) +
                         strainD_til(3, ii) * 2.0 * beta(7) * beta(8) +
                         strainD_til(4, ii) * (beta(2) * beta(7) + beta(1) * beta(8)) +
                         strainD_til(5, ii) * (beta(5) * beta(7) + beta(4) * beta(8));
    }

    /// Gd : Jacobian (w.r.t. coordinates) of the initial position vector gradient matrix
    ChMatrixNM<double, 9, 24> Gd;
    Gd.setZero();

    for (int ii = 0; ii < 8; ii++) {
        Gd(0, 3 * ii) = j0(0, 0) * Nx(0, ii) + j0(1, 0) * Ny(0, ii) + j0(2, 0) * Nz(0, ii);
        Gd(1, 3 * ii + 1) = j0(0, 0) * Nx(0, ii) + j0(1, 0) * Ny(0, ii) + j0(2, 0) * Nz(0, ii);
        Gd(2, 3 * ii + 2) = j0(0, 0) * Nx(0, ii) + j0(1, 0) * Ny(0, ii) + j0(2, 0) * Nz(0, ii);

        Gd(3, 3 * ii) = j0(0, 1) * Nx(0, ii) + j0(1, 1) * Ny(0, ii) + j0(2, 1) * Nz(0, ii);
        Gd(4, 3 * ii + 1) = j0(0, 1) * Nx(0, ii) + j0(1, 1) * Ny(0, ii) + j0(2, 1) * Nz(0, ii);
        Gd(5, 3 * ii + 2) = j0(0, 1) * Nx(0, ii) + j0(1, 1) * Ny(0, ii) + j0(2, 1) * Nz(0, ii);

        Gd(6, 3 * ii) = j0(0, 2) * Nx(0, ii) + j0(1, 2) * Ny(0, ii) + j0(2, 2) * Nz(0, ii);
        Gd(7, 3 * ii + 1) = j0(0, 2) * Nx(0, ii) + j0(1, 2) * Ny(0, ii) + j0(2, 2) * Nz(0, ii);
        Gd(8, 3 * ii + 2) = j0(0, 2) * Nx(0, ii) + j0(1, 2) * Ny(0, ii) + j0(2, 2) * Nz(0, ii);
    }

    // Enhanced Assumed Strain 2nd
    strain += strain_EAS;

    // Structural damping
    // Strain time derivative for structural damping
    ChVectorN<double, 6> DEPS;
    DEPS.setZero();
    for (int ii = 0; ii < 24; ii++) {
        DEPS(0) += strainD(0, ii) * m_element->m_d_dt(ii);
        DEPS(1) += strainD(1, ii) * m_element->m_d_dt(ii);
        DEPS(2) += strainD(2, ii) * m_element->m_d_dt(ii);
        DEPS(3) += strainD(3, ii) * m_element->m_d_dt(ii);
        DEPS(4) += strainD(4, ii) * m_element->m_d_dt(ii);
        DEPS(5) += strainD(5, ii) * m_element->m_d_dt(ii);
    }

    // Add structural damping
    strain += DEPS * m_element->m_Alpha;

    // Matrix of elastic coefficients: The input assumes the material *could* be orthotropic
    const ChMatrixNM<double, 6, 6>& E_eps = m_element->GetLayer(m_kl).GetMaterial()->Get_E_eps();

    // Stress tensor calculation
    ChVectorN<double, 6> stress = E_eps * strain;

    // Declaration and computation of Sigm, to be removed
    ChMatrixNM<double, 9, 9> Sigm;  ///< Rearrangement of stress vector (not always needed)
    Sigm.setZero();

    Sigm(0, 0) = stress(0);  // XX
    Sigm(1, 1) = stress(0);
    Sigm(2, 2) = stress(0);

    Sigm(0, 3) = stress(2);  // XY
    Sigm(1, 4) = stress(2);
    Sigm(2, 5) = stress(2);

    Sigm(0, 6) = stress(4);  // XZ
    Sigm(1, 7) = stress(4);
    Sigm(2, 8) = stress(4);

    Sigm(3, 0) = stress(2);  // XY
    Sigm(4, 1) = stress(2);
    Sigm(5, 2) = stress(2);

    Sigm(3, 3) = stress(1);  // YY
    Sigm(4, 4) = stress(1);
    Sigm(5, 5) = stress(1);

    Sigm(3, 6) = stress(5);  // YZ
    Sigm(4, 7) = stress(5);
    Sigm(5, 8) = stress(5);

    Sigm(6, 0) = stress(4);  // XZ
    Sigm(7, 1) = stress(4);
    Sigm(8, 2) = stress(4);

    Sigm(6, 3) = stress(5);  // YZ
    Sigm(7, 4) = stress(5);
    Sigm(8, 5) = stress(5);

    Sigm(6, 6) = stress(3);  // ZZ
    Sigm(7, 7) = stress(3);
    Sigm(8, 8) = stress(3);

    // Jacobian of internal forces (excluding the EAS contribution).
    ChMatrixNM<double, 24, 24> KTE;
    KTE = (strainD.transpose() * E_eps * strainD) * (m_Kfactor + m_Rfactor * m_element->m_Alpha) +
          (Gd.transpose() * Sigm * Gd) * m_Kfactor;
    KTE *= detJ0 * m_element->m_GaussScaling;

    // EAS cross-dependency matrix.
    ChMatrixNM<double, 5, 24> GDEPSP = (G.transpose() * E_eps * strainD) * (detJ0 * m_element->m_GaussScaling);

    // Load result vector (integrand)
    result.segment(0, 24 * 24) = Eigen::Map<ChVectorN<double, 24 * 24>>(KTE.data(), 24 * 24);
    result.segment(576, 5 * 24) = Eigen::Map<ChVectorN<double, 5 * 24>>(GDEPSP.data(), 5 * 24);
}